

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  byte bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined8 uVar27;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [60];
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  byte bVar47;
  uint uVar48;
  ulong uVar49;
  uint uVar51;
  long lVar52;
  ulong uVar53;
  uint uVar54;
  uint uVar55;
  ulong uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar102 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar103 [64];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar109 [64];
  undefined1 auVar111 [64];
  undefined1 auVar113 [64];
  undefined1 auVar115 [64];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar117 [64];
  int iVar118;
  float fVar119;
  vint4 bi_2;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [64];
  undefined4 uVar123;
  vint4 bi_1;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  float fVar137;
  float fVar145;
  float fVar146;
  vint4 bi;
  float fVar147;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  float fVar161;
  float fVar167;
  vint4 ai_2;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  vint4 ai;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  vint4 ai_1;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  vfloat4 a0_2;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  float fVar219;
  float fVar230;
  float fVar231;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar232;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar233;
  float fVar234;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar241;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar253;
  float fVar260;
  float fVar261;
  vfloat4 a0;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar262;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  vfloat4 a0_1;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  int iVar274;
  undefined1 in_ZMM30 [64];
  undefined1 auVar275 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_660;
  undefined1 local_630 [16];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  uint auStack_5e0 [4];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [16];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  uint uStack_460;
  float afStack_45c [7];
  undefined1 local_440 [64];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar50;
  undefined1 auVar108 [64];
  undefined1 auVar110 [64];
  undefined1 auVar112 [64];
  undefined1 auVar114 [64];
  undefined1 auVar116 [64];
  
  PVar3 = prim[1];
  uVar53 = (ulong)(byte)PVar3;
  fVar119 = *(float *)(prim + uVar53 * 0x19 + 0x12);
  auVar57 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar57 = vinsertps_avx(auVar57,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar58 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar58 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar57 = vsubps_avx(auVar57,*(undefined1 (*) [16])(prim + uVar53 * 0x19 + 6));
  auVar77._0_4_ = fVar119 * auVar57._0_4_;
  auVar77._4_4_ = fVar119 * auVar57._4_4_;
  auVar77._8_4_ = fVar119 * auVar57._8_4_;
  auVar77._12_4_ = fVar119 * auVar57._12_4_;
  auVar64._0_4_ = fVar119 * auVar58._0_4_;
  auVar64._4_4_ = fVar119 * auVar58._4_4_;
  auVar64._8_4_ = fVar119 * auVar58._8_4_;
  auVar64._12_4_ = fVar119 * auVar58._12_4_;
  auVar57 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 4 + 6)));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 5 + 6)));
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar59 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 6 + 6)));
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 0xb + 6)));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar53 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  uVar56 = (ulong)(uint)((int)(uVar53 * 9) * 2);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + uVar53 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  uVar49 = (ulong)(uint)((int)(uVar53 * 5) << 2);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar254._4_4_ = auVar64._0_4_;
  auVar254._0_4_ = auVar64._0_4_;
  auVar254._8_4_ = auVar64._0_4_;
  auVar254._12_4_ = auVar64._0_4_;
  auVar62 = vshufps_avx(auVar64,auVar64,0x55);
  auVar60 = vshufps_avx(auVar64,auVar64,0xaa);
  fVar119 = auVar60._0_4_;
  auVar75._0_4_ = fVar119 * auVar59._0_4_;
  fVar234 = auVar60._4_4_;
  auVar75._4_4_ = fVar234 * auVar59._4_4_;
  fVar219 = auVar60._8_4_;
  auVar75._8_4_ = fVar219 * auVar59._8_4_;
  fVar230 = auVar60._12_4_;
  auVar75._12_4_ = fVar230 * auVar59._12_4_;
  auVar71._0_4_ = auVar68._0_4_ * fVar119;
  auVar71._4_4_ = auVar68._4_4_ * fVar234;
  auVar71._8_4_ = auVar68._8_4_ * fVar219;
  auVar71._12_4_ = auVar68._12_4_ * fVar230;
  auVar65._0_4_ = auVar26._0_4_ * fVar119;
  auVar65._4_4_ = auVar26._4_4_ * fVar234;
  auVar65._8_4_ = auVar26._8_4_ * fVar219;
  auVar65._12_4_ = auVar26._12_4_ * fVar230;
  auVar60 = vfmadd231ps_fma(auVar75,auVar62,auVar58);
  auVar61 = vfmadd231ps_fma(auVar71,auVar62,auVar69);
  auVar62 = vfmadd231ps_fma(auVar65,auVar66,auVar62);
  auVar63 = vfmadd231ps_fma(auVar60,auVar254,auVar57);
  auVar61 = vfmadd231ps_fma(auVar61,auVar254,auVar70);
  auVar64 = vfmadd231ps_fma(auVar62,auVar67,auVar254);
  auVar255._4_4_ = auVar77._0_4_;
  auVar255._0_4_ = auVar77._0_4_;
  auVar255._8_4_ = auVar77._0_4_;
  auVar255._12_4_ = auVar77._0_4_;
  auVar62 = vshufps_avx(auVar77,auVar77,0x55);
  auVar60 = vshufps_avx(auVar77,auVar77,0xaa);
  fVar119 = auVar60._0_4_;
  auVar267._0_4_ = fVar119 * auVar59._0_4_;
  fVar234 = auVar60._4_4_;
  auVar267._4_4_ = fVar234 * auVar59._4_4_;
  fVar219 = auVar60._8_4_;
  auVar267._8_4_ = fVar219 * auVar59._8_4_;
  fVar230 = auVar60._12_4_;
  auVar267._12_4_ = fVar230 * auVar59._12_4_;
  auVar74._0_4_ = auVar68._0_4_ * fVar119;
  auVar74._4_4_ = auVar68._4_4_ * fVar234;
  auVar74._8_4_ = auVar68._8_4_ * fVar219;
  auVar74._12_4_ = auVar68._12_4_ * fVar230;
  auVar73._0_4_ = auVar26._0_4_ * fVar119;
  auVar73._4_4_ = auVar26._4_4_ * fVar234;
  auVar73._8_4_ = auVar26._8_4_ * fVar219;
  auVar73._12_4_ = auVar26._12_4_ * fVar230;
  auVar58 = vfmadd231ps_fma(auVar267,auVar62,auVar58);
  auVar59 = vfmadd231ps_fma(auVar74,auVar62,auVar69);
  auVar69 = vfmadd231ps_fma(auVar73,auVar62,auVar66);
  auVar68 = vfmadd231ps_fma(auVar58,auVar255,auVar57);
  auVar66 = vfmadd231ps_fma(auVar59,auVar255,auVar70);
  auVar103._16_48_ = in_ZmmResult._16_48_;
  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar271 = ZEXT1664(auVar57);
  auVar26 = vfmadd231ps_fma(auVar69,auVar255,auVar67);
  auVar58 = vandps_avx512vl(auVar63,auVar57);
  auVar177._8_4_ = 0x219392ef;
  auVar177._0_8_ = 0x219392ef219392ef;
  auVar177._12_4_ = 0x219392ef;
  uVar56 = vcmpps_avx512vl(auVar58,auVar177,1);
  bVar10 = (bool)((byte)uVar56 & 1);
  auVar60._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar63._0_4_;
  bVar10 = (bool)((byte)(uVar56 >> 1) & 1);
  auVar60._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar63._4_4_;
  bVar10 = (bool)((byte)(uVar56 >> 2) & 1);
  auVar60._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar63._8_4_;
  bVar10 = (bool)((byte)(uVar56 >> 3) & 1);
  auVar60._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar63._12_4_;
  auVar58 = vandps_avx512vl(auVar61,auVar57);
  uVar56 = vcmpps_avx512vl(auVar58,auVar177,1);
  bVar10 = (bool)((byte)uVar56 & 1);
  auVar63._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar61._0_4_;
  bVar10 = (bool)((byte)(uVar56 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar61._4_4_;
  bVar10 = (bool)((byte)(uVar56 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar61._8_4_;
  bVar10 = (bool)((byte)(uVar56 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar61._12_4_;
  auVar57 = vandps_avx512vl(auVar64,auVar57);
  uVar56 = vcmpps_avx512vl(auVar57,auVar177,1);
  bVar10 = (bool)((byte)uVar56 & 1);
  auVar61._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar64._0_4_;
  bVar10 = (bool)((byte)(uVar56 >> 1) & 1);
  auVar61._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar64._4_4_;
  bVar10 = (bool)((byte)(uVar56 >> 2) & 1);
  auVar61._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar64._8_4_;
  bVar10 = (bool)((byte)(uVar56 >> 3) & 1);
  auVar61._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar64._12_4_;
  auVar57 = vrcp14ps_avx512vl(auVar60);
  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar272 = ZEXT1664(auVar58);
  auVar59 = vfnmadd213ps_avx512vl(auVar60,auVar57,auVar58);
  auVar70 = vfmadd132ps_fma(auVar59,auVar57,auVar57);
  auVar57 = vrcp14ps_avx512vl(auVar63);
  auVar59 = vfnmadd213ps_avx512vl(auVar63,auVar57,auVar58);
  auVar69 = vfmadd132ps_fma(auVar59,auVar57,auVar57);
  auVar57 = vrcp14ps_avx512vl(auVar61);
  auVar58 = vfnmadd213ps_avx512vl(auVar61,auVar57,auVar58);
  auVar67 = vfmadd132ps_fma(auVar58,auVar57,auVar57);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar53 * 7 + 6);
  auVar57 = vpmovsxwd_avx(auVar57);
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar57 = vsubps_avx(auVar57,auVar68);
  auVar168._0_4_ = auVar70._0_4_ * auVar57._0_4_;
  auVar168._4_4_ = auVar70._4_4_ * auVar57._4_4_;
  auVar168._8_4_ = auVar70._8_4_ * auVar57._8_4_;
  auVar168._12_4_ = auVar70._12_4_ * auVar57._12_4_;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar53 * 9 + 6);
  auVar57 = vpmovsxwd_avx(auVar58);
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar57 = vsubps_avx(auVar57,auVar68);
  auVar60 = vpbroadcastd_avx512vl();
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar58 = vpmovsxwd_avx(auVar59);
  auVar76._0_4_ = auVar70._0_4_ * auVar57._0_4_;
  auVar76._4_4_ = auVar70._4_4_ * auVar57._4_4_;
  auVar76._8_4_ = auVar70._8_4_ * auVar57._8_4_;
  auVar76._12_4_ = auVar70._12_4_ * auVar57._12_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar53 * -2 + 6);
  auVar57 = vpmovsxwd_avx(auVar70);
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar57 = vsubps_avx(auVar57,auVar66);
  auVar78._0_4_ = auVar69._0_4_ * auVar57._0_4_;
  auVar78._4_4_ = auVar69._4_4_ * auVar57._4_4_;
  auVar78._8_4_ = auVar69._8_4_ * auVar57._8_4_;
  auVar78._12_4_ = auVar69._12_4_ * auVar57._12_4_;
  auVar57 = vcvtdq2ps_avx(auVar58);
  auVar57 = vsubps_avx(auVar57,auVar66);
  auVar72._0_4_ = auVar69._0_4_ * auVar57._0_4_;
  auVar72._4_4_ = auVar69._4_4_ * auVar57._4_4_;
  auVar72._8_4_ = auVar69._8_4_ * auVar57._8_4_;
  auVar72._12_4_ = auVar69._12_4_ * auVar57._12_4_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar49 + uVar53 + 6);
  auVar57 = vpmovsxwd_avx(auVar69);
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar57 = vsubps_avx(auVar57,auVar26);
  auVar80._0_4_ = auVar67._0_4_ * auVar57._0_4_;
  auVar80._4_4_ = auVar67._4_4_ * auVar57._4_4_;
  auVar80._8_4_ = auVar67._8_4_ * auVar57._8_4_;
  auVar80._12_4_ = auVar67._12_4_ * auVar57._12_4_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar53 * 0x17 + 6);
  auVar57 = vpmovsxwd_avx(auVar68);
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar57 = vsubps_avx(auVar57,auVar26);
  auVar79._0_4_ = auVar67._0_4_ * auVar57._0_4_;
  auVar79._4_4_ = auVar67._4_4_ * auVar57._4_4_;
  auVar79._8_4_ = auVar67._8_4_ * auVar57._8_4_;
  auVar79._12_4_ = auVar67._12_4_ * auVar57._12_4_;
  auVar57 = vpminsd_avx(auVar168,auVar76);
  auVar58 = vpminsd_avx(auVar78,auVar72);
  auVar57 = vmaxps_avx(auVar57,auVar58);
  auVar58 = vpminsd_avx(auVar80,auVar79);
  uVar123 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar67._4_4_ = uVar123;
  auVar67._0_4_ = uVar123;
  auVar67._8_4_ = uVar123;
  auVar67._12_4_ = uVar123;
  auVar58 = vmaxps_avx512vl(auVar58,auVar67);
  auVar57 = vmaxps_avx(auVar57,auVar58);
  auVar66._8_4_ = 0x3f7ffffa;
  auVar66._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar66._12_4_ = 0x3f7ffffa;
  local_5d0 = vmulps_avx512vl(auVar57,auVar66);
  auVar57 = vpmaxsd_avx(auVar168,auVar76);
  auVar58 = vpmaxsd_avx(auVar78,auVar72);
  auVar57 = vminps_avx(auVar57,auVar58);
  auVar58 = vpmaxsd_avx(auVar80,auVar79);
  uVar123 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar26._4_4_ = uVar123;
  auVar26._0_4_ = uVar123;
  auVar26._8_4_ = uVar123;
  auVar26._12_4_ = uVar123;
  auVar58 = vminps_avx512vl(auVar58,auVar26);
  auVar57 = vminps_avx(auVar57,auVar58);
  auVar62._8_4_ = 0x3f800003;
  auVar62._0_8_ = 0x3f8000033f800003;
  auVar62._12_4_ = 0x3f800003;
  auVar57 = vmulps_avx512vl(auVar57,auVar62);
  uVar27 = vcmpps_avx512vl(local_5d0,auVar57,2);
  uVar56 = vpcmpgtd_avx512vl(auVar60,_DAT_01ff0cf0);
  uVar56 = ((byte)uVar27 & 0xf) & uVar56;
  if ((char)uVar56 == '\0') {
    return;
  }
  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar273 = ZEXT1664(auVar57);
  auVar122 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar122);
  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar122 = ZEXT1664(auVar57);
  auVar57 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar275 = ZEXT1664(auVar57);
LAB_01b7ae14:
  lVar52 = 0;
  for (uVar49 = uVar56; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
    lVar52 = lVar52 + 1;
  }
  uVar54 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar52 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar54].ptr;
  uVar49 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4);
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar57 = *(undefined1 (*) [16])(_Var9 + uVar49 * (long)pvVar8);
  auVar58 = *(undefined1 (*) [16])(_Var9 + (uVar49 + 1) * (long)pvVar8);
  auVar59 = *(undefined1 (*) [16])(_Var9 + (uVar49 + 2) * (long)pvVar8);
  auVar70 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar49 + 3));
  lVar52 = *(long *)&pGVar6[1].time_range.upper;
  auVar69 = *(undefined1 (*) [16])(lVar52 + (long)p_Var7 * uVar49);
  auVar68 = *(undefined1 (*) [16])(lVar52 + (long)p_Var7 * (uVar49 + 1));
  auVar67 = *(undefined1 (*) [16])(lVar52 + (long)p_Var7 * (uVar49 + 2));
  uVar56 = uVar56 - 1 & uVar56;
  auVar66 = *(undefined1 (*) [16])(lVar52 + (long)p_Var7 * (uVar49 + 3));
  if (uVar56 != 0) {
    uVar53 = uVar56 - 1 & uVar56;
    for (uVar49 = uVar56; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
    }
    if (uVar53 != 0) {
      for (; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar26 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar26 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  fVar119 = *(float *)(ray + k * 4 + 0xc0);
  auVar71 = auVar273._0_16_;
  auVar60 = vmulps_avx512vl(auVar66,auVar71);
  auVar124._0_12_ = ZEXT812(0);
  auVar124._12_4_ = 0;
  auVar62 = vfmadd213ps_fma(auVar124,auVar67,auVar60);
  auVar125._0_4_ = auVar68._0_4_ + auVar62._0_4_;
  auVar125._4_4_ = auVar68._4_4_ + auVar62._4_4_;
  auVar125._8_4_ = auVar68._8_4_ + auVar62._8_4_;
  auVar125._12_4_ = auVar68._12_4_ + auVar62._12_4_;
  auVar61 = vfmadd231ps_avx512vl(auVar125,auVar69,auVar71);
  auVar269._0_16_ = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar62 = vmulps_avx512vl(auVar66,auVar269._0_16_);
  auVar79 = auVar122._0_16_;
  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar67,auVar79);
  auVar62 = vfmadd231ps_avx512vl(auVar62,auVar68,auVar269._0_16_);
  auVar63 = vfnmadd231ps_avx512vl(auVar62,auVar69,auVar79);
  auVar64 = vmulps_avx512vl(auVar70,auVar71);
  auVar62 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar59,auVar64);
  auVar256._0_4_ = auVar62._0_4_ + auVar58._0_4_;
  auVar256._4_4_ = auVar62._4_4_ + auVar58._4_4_;
  auVar256._8_4_ = auVar62._8_4_ + auVar58._8_4_;
  auVar256._12_4_ = auVar62._12_4_ + auVar58._12_4_;
  auVar62 = vfmadd231ps_avx512vl(auVar256,auVar57,auVar71);
  auVar65 = vmulps_avx512vl(auVar70,auVar269._0_16_);
  auVar65 = vfmadd231ps_avx512vl(auVar65,auVar59,auVar79);
  auVar65 = vfmadd231ps_avx512vl(auVar65,auVar58,auVar269._0_16_);
  auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar57,auVar79);
  auVar148._0_4_ = auVar67._0_4_ + auVar60._0_4_;
  auVar148._4_4_ = auVar67._4_4_ + auVar60._4_4_;
  auVar148._8_4_ = auVar67._8_4_ + auVar60._8_4_;
  auVar148._12_4_ = auVar67._12_4_ + auVar60._12_4_;
  auVar60 = vfmadd231ps_avx512vl(auVar148,auVar68,auVar269._0_16_);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar69,auVar71);
  auVar66 = vmulps_avx512vl(auVar66,auVar79);
  auVar67 = vfmadd231ps_avx512vl(auVar66,auVar269._0_16_,auVar67);
  auVar68 = vfnmadd231ps_avx512vl(auVar67,auVar79,auVar68);
  auVar67 = vfmadd231ps_avx512vl(auVar68,auVar269._0_16_,auVar69);
  auVar214._0_4_ = auVar64._0_4_ + auVar59._0_4_;
  auVar214._4_4_ = auVar64._4_4_ + auVar59._4_4_;
  auVar214._8_4_ = auVar64._8_4_ + auVar59._8_4_;
  auVar214._12_4_ = auVar64._12_4_ + auVar59._12_4_;
  auVar69 = vfmadd231ps_avx512vl(auVar214,auVar58,auVar269._0_16_);
  auVar69 = vfmadd231ps_avx512vl(auVar69,auVar57,auVar71);
  auVar70 = vmulps_avx512vl(auVar70,auVar79);
  auVar59 = vfmadd231ps_avx512vl(auVar70,auVar269._0_16_,auVar59);
  auVar58 = vfnmadd231ps_avx512vl(auVar59,auVar79,auVar58);
  auVar68 = vfmadd231ps_avx512vl(auVar58,auVar269._0_16_,auVar57);
  auVar57 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar58 = vshufps_avx(auVar62,auVar62,0xc9);
  fVar137 = auVar63._0_4_;
  auVar178._0_4_ = fVar137 * auVar58._0_4_;
  fVar145 = auVar63._4_4_;
  auVar178._4_4_ = fVar145 * auVar58._4_4_;
  fVar146 = auVar63._8_4_;
  auVar178._8_4_ = fVar146 * auVar58._8_4_;
  fVar147 = auVar63._12_4_;
  auVar178._12_4_ = fVar147 * auVar58._12_4_;
  auVar58 = vfmsub231ps_fma(auVar178,auVar57,auVar62);
  auVar59 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar58 = vshufps_avx(auVar65,auVar65,0xc9);
  auVar179._0_4_ = fVar137 * auVar58._0_4_;
  auVar179._4_4_ = fVar145 * auVar58._4_4_;
  auVar179._8_4_ = fVar146 * auVar58._8_4_;
  auVar179._12_4_ = fVar147 * auVar58._12_4_;
  auVar57 = vfmsub231ps_fma(auVar179,auVar57,auVar65);
  auVar70 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar57 = vshufps_avx(auVar67,auVar67,0xc9);
  auVar58 = vshufps_avx(auVar69,auVar69,0xc9);
  fVar161 = auVar67._0_4_;
  auVar169._0_4_ = fVar161 * auVar58._0_4_;
  fVar167 = auVar67._4_4_;
  auVar169._4_4_ = fVar167 * auVar58._4_4_;
  fVar232 = auVar67._8_4_;
  auVar169._8_4_ = fVar232 * auVar58._8_4_;
  fVar233 = auVar67._12_4_;
  auVar169._12_4_ = fVar233 * auVar58._12_4_;
  auVar58 = vfmsub231ps_fma(auVar169,auVar57,auVar69);
  auVar69 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar58 = vshufps_avx(auVar68,auVar68,0xc9);
  auVar215._0_4_ = auVar58._0_4_ * fVar161;
  auVar215._4_4_ = auVar58._4_4_ * fVar167;
  auVar215._8_4_ = auVar58._8_4_ * fVar232;
  auVar215._12_4_ = auVar58._12_4_ * fVar233;
  auVar58 = vfmsub231ps_fma(auVar215,auVar57,auVar68);
  auVar57 = vdpps_avx(auVar59,auVar59,0x7f);
  auVar68 = vshufps_avx(auVar58,auVar58,0xc9);
  fVar219 = auVar57._0_4_;
  auVar269._16_48_ = auVar103._16_48_;
  auVar122._4_60_ = auVar269._4_60_;
  auVar122._0_4_ = fVar219;
  auVar58 = vrsqrt14ss_avx512f(auVar269._0_16_,auVar122._0_16_);
  fVar234 = auVar58._0_4_;
  auVar66 = vmulss_avx512f(auVar57,ZEXT416(0xbf000000));
  auVar58 = vdpps_avx(auVar59,auVar70,0x7f);
  fVar234 = fVar234 * 1.5 + auVar66._0_4_ * fVar234 * fVar234 * fVar234;
  fVar241 = fVar234 * auVar59._0_4_;
  fVar250 = fVar234 * auVar59._4_4_;
  fVar251 = fVar234 * auVar59._8_4_;
  fVar252 = fVar234 * auVar59._12_4_;
  auVar220._0_4_ = auVar70._0_4_ * fVar219;
  auVar220._4_4_ = auVar70._4_4_ * fVar219;
  auVar220._8_4_ = auVar70._8_4_ * fVar219;
  auVar220._12_4_ = auVar70._12_4_ * fVar219;
  fVar219 = auVar58._0_4_;
  auVar188._0_4_ = fVar219 * auVar59._0_4_;
  auVar188._4_4_ = fVar219 * auVar59._4_4_;
  auVar188._8_4_ = fVar219 * auVar59._8_4_;
  auVar188._12_4_ = fVar219 * auVar59._12_4_;
  auVar59 = vsubps_avx(auVar220,auVar188);
  auVar58 = vrcp14ss_avx512f(auVar269._0_16_,auVar122._0_16_);
  auVar57 = vfnmadd213ss_avx512f(auVar57,auVar58,ZEXT416(0x40000000));
  fVar230 = auVar58._0_4_ * auVar57._0_4_;
  auVar57 = vdpps_avx(auVar69,auVar69,0x7f);
  fVar231 = auVar57._0_4_;
  auVar102._16_48_ = auVar103._16_48_;
  auVar102._0_16_ = auVar269._0_16_;
  auVar270._4_60_ = auVar102._4_60_;
  auVar270._0_4_ = fVar231;
  auVar58 = vrsqrt14ss_avx512f(auVar269._0_16_,auVar270._0_16_);
  fVar219 = auVar58._0_4_;
  auVar58 = vmulss_avx512f(auVar57,ZEXT416(0xbf000000));
  fVar219 = fVar219 * 1.5 + auVar58._0_4_ * fVar219 * fVar219 * fVar219;
  auVar58 = vdpps_avx(auVar69,auVar68,0x7f);
  fVar253 = fVar219 * auVar69._0_4_;
  fVar260 = fVar219 * auVar69._4_4_;
  fVar261 = fVar219 * auVar69._8_4_;
  fVar262 = fVar219 * auVar69._12_4_;
  auVar180._0_4_ = fVar231 * auVar68._0_4_;
  auVar180._4_4_ = fVar231 * auVar68._4_4_;
  auVar180._8_4_ = fVar231 * auVar68._8_4_;
  auVar180._12_4_ = fVar231 * auVar68._12_4_;
  fVar231 = auVar58._0_4_;
  auVar170._0_4_ = fVar231 * auVar69._0_4_;
  auVar170._4_4_ = fVar231 * auVar69._4_4_;
  auVar170._8_4_ = fVar231 * auVar69._8_4_;
  auVar170._12_4_ = fVar231 * auVar69._12_4_;
  auVar70 = vsubps_avx(auVar180,auVar170);
  auVar58 = vrcp14ss_avx512f(auVar269._0_16_,auVar270._0_16_);
  auVar57 = vfnmadd213ss_avx512f(auVar57,auVar58,ZEXT416(0x40000000));
  fVar231 = auVar57._0_4_ * auVar58._0_4_;
  auVar57 = vshufps_avx(auVar61,auVar61,0xff);
  auVar199._0_4_ = fVar241 * auVar57._0_4_;
  auVar199._4_4_ = fVar250 * auVar57._4_4_;
  auVar199._8_4_ = fVar251 * auVar57._8_4_;
  auVar199._12_4_ = fVar252 * auVar57._12_4_;
  local_510 = vsubps_avx(auVar61,auVar199);
  auVar58 = vshufps_avx(auVar63,auVar63,0xff);
  auVar181._0_4_ = auVar58._0_4_ * fVar241 + auVar57._0_4_ * fVar234 * fVar230 * auVar59._0_4_;
  auVar181._4_4_ = auVar58._4_4_ * fVar250 + auVar57._4_4_ * fVar234 * fVar230 * auVar59._4_4_;
  auVar181._8_4_ = auVar58._8_4_ * fVar251 + auVar57._8_4_ * fVar234 * fVar230 * auVar59._8_4_;
  auVar181._12_4_ = auVar58._12_4_ * fVar252 + auVar57._12_4_ * fVar234 * fVar230 * auVar59._12_4_;
  auVar59 = vsubps_avx(auVar63,auVar181);
  local_520._0_4_ = auVar199._0_4_ + auVar61._0_4_;
  local_520._4_4_ = auVar199._4_4_ + auVar61._4_4_;
  fStack_518 = auVar199._8_4_ + auVar61._8_4_;
  fStack_514 = auVar199._12_4_ + auVar61._12_4_;
  auVar57 = vshufps_avx(auVar60,auVar60,0xff);
  auVar182._0_4_ = fVar253 * auVar57._0_4_;
  auVar182._4_4_ = fVar260 * auVar57._4_4_;
  auVar182._8_4_ = fVar261 * auVar57._8_4_;
  auVar182._12_4_ = fVar262 * auVar57._12_4_;
  local_530 = vsubps_avx512vl(auVar60,auVar182);
  auVar58 = vshufps_avx(auVar67,auVar67,0xff);
  auVar138._0_4_ = auVar58._0_4_ * fVar253 + auVar57._0_4_ * fVar219 * auVar70._0_4_ * fVar231;
  auVar138._4_4_ = auVar58._4_4_ * fVar260 + auVar57._4_4_ * fVar219 * auVar70._4_4_ * fVar231;
  auVar138._8_4_ = auVar58._8_4_ * fVar261 + auVar57._8_4_ * fVar219 * auVar70._8_4_ * fVar231;
  auVar138._12_4_ = auVar58._12_4_ * fVar262 + auVar57._12_4_ * fVar219 * auVar70._12_4_ * fVar231;
  auVar57 = vsubps_avx(auVar67,auVar138);
  local_540._0_4_ = auVar60._0_4_ + auVar182._0_4_;
  local_540._4_4_ = auVar60._4_4_ + auVar182._4_4_;
  fStack_538 = auVar60._8_4_ + auVar182._8_4_;
  fStack_534 = auVar60._12_4_ + auVar182._12_4_;
  auVar149._0_4_ = auVar59._0_4_ * 0.33333334;
  auVar149._4_4_ = auVar59._4_4_ * 0.33333334;
  auVar149._8_4_ = auVar59._8_4_ * 0.33333334;
  auVar149._12_4_ = auVar59._12_4_ * 0.33333334;
  local_550 = vaddps_avx512vl(local_510,auVar149);
  auVar150._0_4_ = auVar57._0_4_ * 0.33333334;
  auVar150._4_4_ = auVar57._4_4_ * 0.33333334;
  auVar150._8_4_ = auVar57._8_4_ * 0.33333334;
  auVar150._12_4_ = auVar57._12_4_ * 0.33333334;
  local_560 = vsubps_avx512vl(local_530,auVar150);
  auVar126._0_4_ = (fVar137 + auVar181._0_4_) * 0.33333334;
  auVar126._4_4_ = (fVar145 + auVar181._4_4_) * 0.33333334;
  auVar126._8_4_ = (fVar146 + auVar181._8_4_) * 0.33333334;
  auVar126._12_4_ = (fVar147 + auVar181._12_4_) * 0.33333334;
  _local_570 = vaddps_avx512vl(_local_520,auVar126);
  auVar127._0_4_ = (fVar161 + auVar138._0_4_) * 0.33333334;
  auVar127._4_4_ = (fVar167 + auVar138._4_4_) * 0.33333334;
  auVar127._8_4_ = (fVar232 + auVar138._8_4_) * 0.33333334;
  auVar127._12_4_ = (fVar233 + auVar138._12_4_) * 0.33333334;
  _local_580 = vsubps_avx512vl(_local_540,auVar127);
  local_490 = vsubps_avx(local_510,auVar26);
  uVar123 = local_490._0_4_;
  auVar139._4_4_ = uVar123;
  auVar139._0_4_ = uVar123;
  auVar139._8_4_ = uVar123;
  auVar139._12_4_ = uVar123;
  auVar57 = vshufps_avx(local_490,local_490,0x55);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  auVar58 = vshufps_avx(local_490,local_490,0xaa);
  fVar234 = pre->ray_space[k].vz.field_0.m128[0];
  fVar219 = pre->ray_space[k].vz.field_0.m128[1];
  fVar230 = pre->ray_space[k].vz.field_0.m128[2];
  fVar231 = pre->ray_space[k].vz.field_0.m128[3];
  auVar128._0_4_ = fVar234 * auVar58._0_4_;
  auVar128._4_4_ = fVar219 * auVar58._4_4_;
  auVar128._8_4_ = fVar230 * auVar58._8_4_;
  auVar128._12_4_ = fVar231 * auVar58._12_4_;
  auVar57 = vfmadd231ps_fma(auVar128,(undefined1  [16])aVar2,auVar57);
  auVar67 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar1,auVar139);
  local_4a0 = vsubps_avx512vl(local_550,auVar26);
  uVar123 = local_4a0._0_4_;
  auVar151._4_4_ = uVar123;
  auVar151._0_4_ = uVar123;
  auVar151._8_4_ = uVar123;
  auVar151._12_4_ = uVar123;
  auVar57 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar58 = vshufps_avx(local_4a0,local_4a0,0xaa);
  auVar140._0_4_ = fVar234 * auVar58._0_4_;
  auVar140._4_4_ = fVar219 * auVar58._4_4_;
  auVar140._8_4_ = fVar230 * auVar58._8_4_;
  auVar140._12_4_ = fVar231 * auVar58._12_4_;
  auVar57 = vfmadd231ps_fma(auVar140,(undefined1  [16])aVar2,auVar57);
  auVar66 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar1,auVar151);
  local_4b0 = vsubps_avx512vl(local_560,auVar26);
  uVar123 = local_4b0._0_4_;
  auVar183._4_4_ = uVar123;
  auVar183._0_4_ = uVar123;
  auVar183._8_4_ = uVar123;
  auVar183._12_4_ = uVar123;
  auVar57 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar58 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar152._0_4_ = fVar234 * auVar58._0_4_;
  auVar152._4_4_ = fVar219 * auVar58._4_4_;
  auVar152._8_4_ = fVar230 * auVar58._8_4_;
  auVar152._12_4_ = fVar231 * auVar58._12_4_;
  auVar57 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar2,auVar57);
  auVar62 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar1,auVar183);
  local_4c0 = vsubps_avx512vl(local_530,auVar26);
  uVar123 = local_4c0._0_4_;
  auVar200._4_4_ = uVar123;
  auVar200._0_4_ = uVar123;
  auVar200._8_4_ = uVar123;
  auVar200._12_4_ = uVar123;
  auVar57 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar58 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar184._0_4_ = fVar234 * auVar58._0_4_;
  auVar184._4_4_ = fVar219 * auVar58._4_4_;
  auVar184._8_4_ = fVar230 * auVar58._8_4_;
  auVar184._12_4_ = fVar231 * auVar58._12_4_;
  auVar57 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar2,auVar57);
  auVar60 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar1,auVar200);
  local_4d0 = vsubps_avx(_local_520,auVar26);
  uVar123 = local_4d0._0_4_;
  auVar201._4_4_ = uVar123;
  auVar201._0_4_ = uVar123;
  auVar201._8_4_ = uVar123;
  auVar201._12_4_ = uVar123;
  auVar57 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar58 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar221._0_4_ = auVar58._0_4_ * fVar234;
  auVar221._4_4_ = auVar58._4_4_ * fVar219;
  auVar221._8_4_ = auVar58._8_4_ * fVar230;
  auVar221._12_4_ = auVar58._12_4_ * fVar231;
  auVar57 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar2,auVar57);
  auVar61 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar1,auVar201);
  local_4e0 = vsubps_avx512vl(_local_570,auVar26);
  uVar123 = local_4e0._0_4_;
  auVar202._4_4_ = uVar123;
  auVar202._0_4_ = uVar123;
  auVar202._8_4_ = uVar123;
  auVar202._12_4_ = uVar123;
  auVar57 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar58 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar235._0_4_ = auVar58._0_4_ * fVar234;
  auVar235._4_4_ = auVar58._4_4_ * fVar219;
  auVar235._8_4_ = auVar58._8_4_ * fVar230;
  auVar235._12_4_ = auVar58._12_4_ * fVar231;
  auVar57 = vfmadd231ps_fma(auVar235,(undefined1  [16])aVar2,auVar57);
  auVar63 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar1,auVar202);
  local_4f0 = vsubps_avx512vl(_local_580,auVar26);
  uVar123 = local_4f0._0_4_;
  auVar203._4_4_ = uVar123;
  auVar203._0_4_ = uVar123;
  auVar203._8_4_ = uVar123;
  auVar203._12_4_ = uVar123;
  auVar57 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar58 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar242._0_4_ = auVar58._0_4_ * fVar234;
  auVar242._4_4_ = auVar58._4_4_ * fVar219;
  auVar242._8_4_ = auVar58._8_4_ * fVar230;
  auVar242._12_4_ = auVar58._12_4_ * fVar231;
  auVar57 = vfmadd231ps_fma(auVar242,(undefined1  [16])aVar2,auVar57);
  auVar64 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar1,auVar203);
  local_500 = vsubps_avx(_local_540,auVar26);
  uVar123 = local_500._0_4_;
  auVar120._4_4_ = uVar123;
  auVar120._0_4_ = uVar123;
  auVar120._8_4_ = uVar123;
  auVar120._12_4_ = uVar123;
  auVar57 = vshufps_avx(local_500,local_500,0x55);
  auVar58 = vshufps_avx(local_500,local_500,0xaa);
  auVar189._0_4_ = auVar58._0_4_ * fVar234;
  auVar189._4_4_ = auVar58._4_4_ * fVar219;
  auVar189._8_4_ = auVar58._8_4_ * fVar230;
  auVar189._12_4_ = auVar58._12_4_ * fVar231;
  auVar57 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar2,auVar57);
  auVar26 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar1,auVar120);
  auVar59 = vmovlhps_avx(auVar67,auVar61);
  auVar70 = vmovlhps_avx(auVar66,auVar63);
  auVar68 = vmovlhps_avx512f(auVar62,auVar64);
  _local_620 = vmovlhps_avx512f(auVar60,auVar26);
  auVar58 = vminps_avx(auVar59,auVar70);
  auVar57 = vmaxps_avx(auVar59,auVar70);
  auVar69 = vminps_avx512vl(auVar68,_local_620);
  auVar58 = vminps_avx(auVar58,auVar69);
  auVar69 = vmaxps_avx512vl(auVar68,_local_620);
  auVar57 = vmaxps_avx(auVar57,auVar69);
  auVar69 = vshufpd_avx(auVar58,auVar58,3);
  auVar58 = vminps_avx(auVar58,auVar69);
  auVar69 = vshufpd_avx(auVar57,auVar57,3);
  auVar57 = vmaxps_avx(auVar57,auVar69);
  auVar58 = vandps_avx512vl(auVar58,auVar271._0_16_);
  auVar57 = vandps_avx512vl(auVar57,auVar271._0_16_);
  auVar57 = vmaxps_avx(auVar58,auVar57);
  auVar58 = vmovshdup_avx(auVar57);
  auVar57 = vmaxss_avx(auVar58,auVar57);
  local_5f0 = vmovddup_avx512vl(auVar67);
  local_600 = vmovddup_avx512vl(auVar66);
  local_610 = vmovddup_avx512vl(auVar62);
  auVar129._8_8_ = auVar60._0_8_;
  auVar129._0_8_ = auVar60._0_8_;
  local_630 = ZEXT416((uint)(auVar57._0_4_ * 9.536743e-07));
  local_3c0 = vbroadcastss_avx512vl(local_630);
  auVar57 = vxorps_avx512vl(local_3c0._0_16_,auVar71);
  local_3e0 = vbroadcastss_avx512vl(auVar57);
  uVar49 = 0;
  auVar57 = vsubps_avx(auVar70,auVar59);
  local_470 = vsubps_avx512vl(auVar68,auVar70);
  local_480 = vsubps_avx512vl(_local_620,auVar68);
  local_590 = vsubps_avx(_local_520,local_510);
  local_5a0 = vsubps_avx512vl(_local_570,local_550);
  local_5b0 = vsubps_avx512vl(_local_580,local_560);
  _local_5c0 = vsubps_avx512vl(_local_540,local_530);
  auVar103 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar103);
  auVar103 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar103);
  auVar58 = ZEXT816(0x3f80000000000000);
  auVar269 = ZEXT1664(auVar58);
  auVar105._32_32_ = auVar103._32_32_;
  do {
    auVar71 = auVar269._0_16_;
    auVar69 = vshufps_avx(auVar71,auVar71,0x50);
    auVar257._8_4_ = 0x3f800000;
    auVar257._0_8_ = &DAT_3f8000003f800000;
    auVar257._12_4_ = 0x3f800000;
    auVar101._16_4_ = 0x3f800000;
    auVar101._0_16_ = auVar257;
    auVar101._20_4_ = 0x3f800000;
    auVar101._24_4_ = 0x3f800000;
    auVar101._28_4_ = 0x3f800000;
    auVar67 = vsubps_avx(auVar257,auVar69);
    fVar234 = auVar69._0_4_;
    fVar137 = auVar61._0_4_;
    auVar153._0_4_ = fVar137 * fVar234;
    fVar219 = auVar69._4_4_;
    fVar145 = auVar61._4_4_;
    auVar153._4_4_ = fVar145 * fVar219;
    fVar230 = auVar69._8_4_;
    auVar153._8_4_ = fVar137 * fVar230;
    fVar231 = auVar69._12_4_;
    auVar153._12_4_ = fVar145 * fVar231;
    fVar161 = auVar63._0_4_;
    auVar162._0_4_ = fVar161 * fVar234;
    fVar167 = auVar63._4_4_;
    auVar162._4_4_ = fVar167 * fVar219;
    auVar162._8_4_ = fVar161 * fVar230;
    auVar162._12_4_ = fVar167 * fVar231;
    fVar250 = auVar64._0_4_;
    auVar171._0_4_ = fVar250 * fVar234;
    fVar251 = auVar64._4_4_;
    auVar171._4_4_ = fVar251 * fVar219;
    auVar171._8_4_ = fVar250 * fVar230;
    auVar171._12_4_ = fVar251 * fVar231;
    fVar146 = auVar26._0_4_;
    auVar130._0_4_ = fVar146 * fVar234;
    fVar147 = auVar26._4_4_;
    auVar130._4_4_ = fVar147 * fVar219;
    auVar130._8_4_ = fVar146 * fVar230;
    auVar130._12_4_ = fVar147 * fVar231;
    auVar66 = vfmadd231ps_avx512vl(auVar153,auVar67,local_5f0);
    auVar62 = vfmadd231ps_avx512vl(auVar162,auVar67,local_600);
    auVar60 = vfmadd231ps_avx512vl(auVar171,auVar67,local_610);
    auVar67 = vfmadd231ps_avx512vl(auVar130,auVar129,auVar67);
    auVar69 = vmovshdup_avx(auVar58);
    fVar219 = auVar58._0_4_;
    fVar234 = (auVar69._0_4_ - fVar219) * 0.04761905;
    auVar94._4_4_ = fVar219;
    auVar94._0_4_ = fVar219;
    auVar94._8_4_ = fVar219;
    auVar94._12_4_ = fVar219;
    auVar94._16_4_ = fVar219;
    auVar94._20_4_ = fVar219;
    auVar94._24_4_ = fVar219;
    auVar94._28_4_ = fVar219;
    auVar97._0_8_ = auVar69._0_8_;
    auVar97._8_8_ = auVar97._0_8_;
    auVar97._16_8_ = auVar97._0_8_;
    auVar97._24_8_ = auVar97._0_8_;
    auVar98 = vsubps_avx(auVar97,auVar94);
    uVar123 = auVar66._0_4_;
    auVar99._4_4_ = uVar123;
    auVar99._0_4_ = uVar123;
    auVar99._8_4_ = uVar123;
    auVar99._12_4_ = uVar123;
    auVar99._16_4_ = uVar123;
    auVar99._20_4_ = uVar123;
    auVar99._24_4_ = uVar123;
    auVar99._28_4_ = uVar123;
    auVar87._8_4_ = 1;
    auVar87._0_8_ = 0x100000001;
    auVar87._12_4_ = 1;
    auVar87._16_4_ = 1;
    auVar87._20_4_ = 1;
    auVar87._24_4_ = 1;
    auVar87._28_4_ = 1;
    auVar96 = ZEXT1632(auVar66);
    auVar95 = vpermps_avx2(auVar87,auVar96);
    auVar81 = vbroadcastss_avx512vl(auVar62);
    auVar97 = ZEXT1632(auVar62);
    auVar82 = vpermps_avx512vl(auVar87,auVar97);
    auVar83 = vbroadcastss_avx512vl(auVar60);
    auVar91 = ZEXT1632(auVar60);
    auVar84 = vpermps_avx512vl(auVar87,auVar91);
    auVar85 = vbroadcastss_avx512vl(auVar67);
    auVar93 = ZEXT1632(auVar67);
    auVar86 = vpermps_avx512vl(auVar87,auVar93);
    auVar100._4_4_ = fVar234;
    auVar100._0_4_ = fVar234;
    auVar100._8_4_ = fVar234;
    auVar100._12_4_ = fVar234;
    auVar100._16_4_ = fVar234;
    auVar100._20_4_ = fVar234;
    auVar100._24_4_ = fVar234;
    auVar100._28_4_ = fVar234;
    auVar92._8_4_ = 2;
    auVar92._0_8_ = 0x200000002;
    auVar92._12_4_ = 2;
    auVar92._16_4_ = 2;
    auVar92._20_4_ = 2;
    auVar92._24_4_ = 2;
    auVar92._28_4_ = 2;
    auVar87 = vpermps_avx512vl(auVar92,auVar96);
    auVar88 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar89 = vpermps_avx512vl(auVar88,auVar96);
    auVar96 = vpermps_avx2(auVar92,auVar97);
    auVar90 = vpermps_avx512vl(auVar88,auVar97);
    auVar97 = vpermps_avx2(auVar92,auVar91);
    auVar91 = vpermps_avx512vl(auVar88,auVar91);
    auVar92 = vpermps_avx512vl(auVar92,auVar93);
    auVar88 = vpermps_avx512vl(auVar88,auVar93);
    auVar69 = vfmadd132ps_fma(auVar98,auVar94,_DAT_02020f20);
    auVar98 = vsubps_avx(auVar101,ZEXT1632(auVar69));
    auVar93 = vmulps_avx512vl(auVar81,ZEXT1632(auVar69));
    auVar101 = ZEXT1632(auVar69);
    auVar94 = vmulps_avx512vl(auVar82,auVar101);
    auVar67 = vfmadd231ps_fma(auVar93,auVar98,auVar99);
    auVar66 = vfmadd231ps_fma(auVar94,auVar98,auVar95);
    auVar93 = vmulps_avx512vl(auVar83,auVar101);
    auVar94 = vmulps_avx512vl(auVar84,auVar101);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,auVar81);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar98,auVar82);
    auVar81 = vmulps_avx512vl(auVar85,auVar101);
    auVar99 = ZEXT1632(auVar69);
    auVar82 = vmulps_avx512vl(auVar86,auVar99);
    auVar83 = vfmadd231ps_avx512vl(auVar81,auVar98,auVar83);
    auVar84 = vfmadd231ps_avx512vl(auVar82,auVar98,auVar84);
    fVar230 = auVar69._0_4_;
    fVar231 = auVar69._4_4_;
    auVar81._4_4_ = fVar231 * auVar93._4_4_;
    auVar81._0_4_ = fVar230 * auVar93._0_4_;
    fVar232 = auVar69._8_4_;
    auVar81._8_4_ = fVar232 * auVar93._8_4_;
    fVar233 = auVar69._12_4_;
    auVar81._12_4_ = fVar233 * auVar93._12_4_;
    auVar81._16_4_ = auVar93._16_4_ * 0.0;
    auVar81._20_4_ = auVar93._20_4_ * 0.0;
    auVar81._24_4_ = auVar93._24_4_ * 0.0;
    auVar81._28_4_ = fVar219;
    auVar82._4_4_ = fVar231 * auVar94._4_4_;
    auVar82._0_4_ = fVar230 * auVar94._0_4_;
    auVar82._8_4_ = fVar232 * auVar94._8_4_;
    auVar82._12_4_ = fVar233 * auVar94._12_4_;
    auVar82._16_4_ = auVar94._16_4_ * 0.0;
    auVar82._20_4_ = auVar94._20_4_ * 0.0;
    auVar82._24_4_ = auVar94._24_4_ * 0.0;
    auVar82._28_4_ = auVar95._28_4_;
    auVar67 = vfmadd231ps_fma(auVar81,auVar98,ZEXT1632(auVar67));
    auVar66 = vfmadd231ps_fma(auVar82,auVar98,ZEXT1632(auVar66));
    auVar86._0_4_ = fVar230 * auVar83._0_4_;
    auVar86._4_4_ = fVar231 * auVar83._4_4_;
    auVar86._8_4_ = fVar232 * auVar83._8_4_;
    auVar86._12_4_ = fVar233 * auVar83._12_4_;
    auVar86._16_4_ = auVar83._16_4_ * 0.0;
    auVar86._20_4_ = auVar83._20_4_ * 0.0;
    auVar86._24_4_ = auVar83._24_4_ * 0.0;
    auVar86._28_4_ = 0;
    auVar95._4_4_ = fVar231 * auVar84._4_4_;
    auVar95._0_4_ = fVar230 * auVar84._0_4_;
    auVar95._8_4_ = fVar232 * auVar84._8_4_;
    auVar95._12_4_ = fVar233 * auVar84._12_4_;
    auVar95._16_4_ = auVar84._16_4_ * 0.0;
    auVar95._20_4_ = auVar84._20_4_ * 0.0;
    auVar95._24_4_ = auVar84._24_4_ * 0.0;
    auVar95._28_4_ = auVar83._28_4_;
    auVar62 = vfmadd231ps_fma(auVar86,auVar98,auVar93);
    auVar60 = vfmadd231ps_fma(auVar95,auVar98,auVar94);
    auVar83._28_4_ = auVar94._28_4_;
    auVar83._0_28_ =
         ZEXT1628(CONCAT412(fVar233 * auVar60._12_4_,
                            CONCAT48(fVar232 * auVar60._8_4_,
                                     CONCAT44(fVar231 * auVar60._4_4_,fVar230 * auVar60._0_4_))));
    auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar233 * auVar62._12_4_,
                                                 CONCAT48(fVar232 * auVar62._8_4_,
                                                          CONCAT44(fVar231 * auVar62._4_4_,
                                                                   fVar230 * auVar62._0_4_)))),
                              auVar98,ZEXT1632(auVar67));
    auVar79 = vfmadd231ps_fma(auVar83,auVar98,ZEXT1632(auVar66));
    auVar95 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar67));
    auVar81 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar66));
    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar95 = vmulps_avx512vl(auVar95,auVar82);
    auVar81 = vmulps_avx512vl(auVar81,auVar82);
    auVar93._0_4_ = fVar234 * auVar95._0_4_;
    auVar93._4_4_ = fVar234 * auVar95._4_4_;
    auVar93._8_4_ = fVar234 * auVar95._8_4_;
    auVar93._12_4_ = fVar234 * auVar95._12_4_;
    auVar93._16_4_ = fVar234 * auVar95._16_4_;
    auVar93._20_4_ = fVar234 * auVar95._20_4_;
    auVar93._24_4_ = fVar234 * auVar95._24_4_;
    auVar93._28_4_ = 0;
    auVar95 = vmulps_avx512vl(auVar100,auVar81);
    auVar62 = vxorps_avx512vl(auVar85._0_16_,auVar85._0_16_);
    auVar81 = vpermt2ps_avx512vl(ZEXT1632(auVar65),_DAT_0205fd20,ZEXT1632(auVar62));
    auVar83 = vpermt2ps_avx512vl(ZEXT1632(auVar79),_DAT_0205fd20,ZEXT1632(auVar62));
    auVar136._0_4_ = auVar93._0_4_ + auVar65._0_4_;
    auVar136._4_4_ = auVar93._4_4_ + auVar65._4_4_;
    auVar136._8_4_ = auVar93._8_4_ + auVar65._8_4_;
    auVar136._12_4_ = auVar93._12_4_ + auVar65._12_4_;
    auVar136._16_4_ = auVar93._16_4_ + 0.0;
    auVar136._20_4_ = auVar93._20_4_ + 0.0;
    auVar136._24_4_ = auVar93._24_4_ + 0.0;
    auVar136._28_4_ = 0;
    auVar94 = ZEXT1632(auVar62);
    auVar84 = vpermt2ps_avx512vl(auVar93,_DAT_0205fd20,auVar94);
    auVar85 = vaddps_avx512vl(ZEXT1632(auVar79),auVar95);
    auVar86 = vpermt2ps_avx512vl(auVar95,_DAT_0205fd20,auVar94);
    auVar95 = vsubps_avx(auVar81,auVar84);
    auVar86 = vsubps_avx512vl(auVar83,auVar86);
    auVar84 = vmulps_avx512vl(auVar96,auVar99);
    auVar93 = vmulps_avx512vl(auVar90,auVar99);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar98,auVar87);
    auVar87 = vfmadd231ps_avx512vl(auVar93,auVar98,auVar89);
    auVar89 = vmulps_avx512vl(auVar97,auVar99);
    auVar93 = vmulps_avx512vl(auVar91,auVar99);
    auVar96 = vfmadd231ps_avx512vl(auVar89,auVar98,auVar96);
    auVar89 = vfmadd231ps_avx512vl(auVar93,auVar98,auVar90);
    auVar90 = vmulps_avx512vl(auVar92,auVar99);
    auVar88 = vmulps_avx512vl(auVar88,auVar99);
    auVar67 = vfmadd231ps_fma(auVar90,auVar98,auVar97);
    auVar66 = vfmadd231ps_fma(auVar88,auVar98,auVar91);
    auVar88 = vmulps_avx512vl(auVar99,auVar96);
    auVar90 = vmulps_avx512vl(ZEXT1632(auVar69),auVar89);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar98,auVar84);
    auVar87 = vfmadd231ps_avx512vl(auVar90,auVar98,auVar87);
    auVar90 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar233 * auVar67._12_4_,
                                            CONCAT48(fVar232 * auVar67._8_4_,
                                                     CONCAT44(fVar231 * auVar67._4_4_,
                                                              fVar230 * auVar67._0_4_)))),auVar98,
                         auVar96);
    auVar89 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar233 * auVar66._12_4_,
                                            CONCAT48(fVar232 * auVar66._8_4_,
                                                     CONCAT44(fVar231 * auVar66._4_4_,
                                                              fVar230 * auVar66._0_4_)))),auVar98,
                         auVar89);
    auVar96._4_4_ = fVar231 * auVar90._4_4_;
    auVar96._0_4_ = fVar230 * auVar90._0_4_;
    auVar96._8_4_ = fVar232 * auVar90._8_4_;
    auVar96._12_4_ = fVar233 * auVar90._12_4_;
    auVar96._16_4_ = auVar90._16_4_ * 0.0;
    auVar96._20_4_ = auVar90._20_4_ * 0.0;
    auVar96._24_4_ = auVar90._24_4_ * 0.0;
    auVar96._28_4_ = auVar91._28_4_;
    auVar84._4_4_ = fVar231 * auVar89._4_4_;
    auVar84._0_4_ = fVar230 * auVar89._0_4_;
    auVar84._8_4_ = fVar232 * auVar89._8_4_;
    auVar84._12_4_ = fVar233 * auVar89._12_4_;
    auVar84._16_4_ = auVar89._16_4_ * 0.0;
    auVar84._20_4_ = auVar89._20_4_ * 0.0;
    auVar84._24_4_ = auVar89._24_4_ * 0.0;
    auVar84._28_4_ = auVar97._28_4_;
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar88);
    auVar97 = vfmadd231ps_avx512vl(auVar84,auVar87,auVar98);
    auVar98 = vsubps_avx512vl(auVar90,auVar88);
    auVar84 = vsubps_avx512vl(auVar89,auVar87);
    auVar87 = vmulps_avx512vl(auVar98,auVar82);
    auVar82 = vmulps_avx512vl(auVar84,auVar82);
    fVar219 = fVar234 * auVar87._0_4_;
    fVar230 = fVar234 * auVar87._4_4_;
    auVar98._4_4_ = fVar230;
    auVar98._0_4_ = fVar219;
    fVar231 = fVar234 * auVar87._8_4_;
    auVar98._8_4_ = fVar231;
    fVar232 = fVar234 * auVar87._12_4_;
    auVar98._12_4_ = fVar232;
    fVar233 = fVar234 * auVar87._16_4_;
    auVar98._16_4_ = fVar233;
    fVar241 = fVar234 * auVar87._20_4_;
    auVar98._20_4_ = fVar241;
    fVar234 = fVar234 * auVar87._24_4_;
    auVar98._24_4_ = fVar234;
    auVar98._28_4_ = auVar87._28_4_;
    auVar82 = vmulps_avx512vl(auVar100,auVar82);
    auVar84 = vpermt2ps_avx512vl(auVar96,_DAT_0205fd20,auVar94);
    auVar88 = vpermt2ps_avx512vl(auVar97,_DAT_0205fd20,auVar94);
    auVar218._0_4_ = auVar96._0_4_ + fVar219;
    auVar218._4_4_ = auVar96._4_4_ + fVar230;
    auVar218._8_4_ = auVar96._8_4_ + fVar231;
    auVar218._12_4_ = auVar96._12_4_ + fVar232;
    auVar218._16_4_ = auVar96._16_4_ + fVar233;
    auVar218._20_4_ = auVar96._20_4_ + fVar241;
    auVar218._24_4_ = auVar96._24_4_ + fVar234;
    auVar218._28_4_ = auVar96._28_4_ + auVar87._28_4_;
    auVar98 = vpermt2ps_avx512vl(auVar98,_DAT_0205fd20,ZEXT1632(auVar62));
    auVar87 = vaddps_avx512vl(auVar97,auVar82);
    auVar82 = vpermt2ps_avx512vl(auVar82,_DAT_0205fd20,ZEXT1632(auVar62));
    auVar98 = vsubps_avx(auVar84,auVar98);
    auVar82 = vsubps_avx512vl(auVar88,auVar82);
    auVar160 = ZEXT1632(auVar65);
    auVar89 = vsubps_avx512vl(auVar96,auVar160);
    auVar166 = ZEXT1632(auVar79);
    auVar90 = vsubps_avx512vl(auVar97,auVar166);
    auVar91 = vsubps_avx512vl(auVar84,auVar81);
    auVar89 = vaddps_avx512vl(auVar89,auVar91);
    auVar91 = vsubps_avx512vl(auVar88,auVar83);
    auVar90 = vaddps_avx512vl(auVar90,auVar91);
    auVar91 = vmulps_avx512vl(auVar166,auVar89);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar160,auVar90);
    auVar92 = vmulps_avx512vl(auVar85,auVar89);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar136,auVar90);
    auVar93 = vmulps_avx512vl(auVar86,auVar89);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar95,auVar90);
    auVar94 = vmulps_avx512vl(auVar83,auVar89);
    auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar81,auVar90);
    auVar99 = vmulps_avx512vl(auVar97,auVar89);
    auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar96,auVar90);
    auVar100 = vmulps_avx512vl(auVar87,auVar89);
    auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar218,auVar90);
    auVar101 = vmulps_avx512vl(auVar82,auVar89);
    auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar98,auVar90);
    auVar89 = vmulps_avx512vl(auVar88,auVar89);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar84,auVar90);
    auVar90 = vminps_avx512vl(auVar91,auVar92);
    auVar91 = vmaxps_avx512vl(auVar91,auVar92);
    auVar92 = vminps_avx512vl(auVar93,auVar94);
    auVar90 = vminps_avx512vl(auVar90,auVar92);
    auVar92 = vmaxps_avx512vl(auVar93,auVar94);
    auVar91 = vmaxps_avx512vl(auVar91,auVar92);
    auVar92 = vminps_avx512vl(auVar99,auVar100);
    auVar93 = vmaxps_avx512vl(auVar99,auVar100);
    auVar94 = vminps_avx512vl(auVar101,auVar89);
    auVar92 = vminps_avx512vl(auVar92,auVar94);
    auVar90 = vminps_avx512vl(auVar90,auVar92);
    auVar89 = vmaxps_avx512vl(auVar101,auVar89);
    auVar89 = vmaxps_avx512vl(auVar93,auVar89);
    auVar89 = vmaxps_avx512vl(auVar91,auVar89);
    uVar27 = vcmpps_avx512vl(auVar90,local_3c0,2);
    uVar28 = vcmpps_avx512vl(auVar89,local_3e0,5);
    uVar55 = 0;
    bVar47 = (byte)uVar27 & (byte)uVar28 & 0x7f;
    if (bVar47 != 0) {
      auVar89 = vsubps_avx512vl(auVar81,auVar160);
      auVar90 = vsubps_avx512vl(auVar83,auVar166);
      auVar91 = vsubps_avx512vl(auVar84,auVar96);
      auVar89 = vaddps_avx512vl(auVar89,auVar91);
      auVar91 = vsubps_avx512vl(auVar88,auVar97);
      auVar90 = vaddps_avx512vl(auVar90,auVar91);
      auVar91 = vmulps_avx512vl(auVar166,auVar89);
      auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar90,auVar160);
      auVar85 = vmulps_avx512vl(auVar85,auVar89);
      auVar85 = vfnmadd213ps_avx512vl(auVar136,auVar90,auVar85);
      auVar86 = vmulps_avx512vl(auVar86,auVar89);
      auVar86 = vfnmadd213ps_avx512vl(auVar95,auVar90,auVar86);
      auVar95 = vmulps_avx512vl(auVar83,auVar89);
      auVar83 = vfnmadd231ps_avx512vl(auVar95,auVar90,auVar81);
      auVar95 = vmulps_avx512vl(auVar97,auVar89);
      auVar97 = vfnmadd231ps_avx512vl(auVar95,auVar90,auVar96);
      auVar95 = vmulps_avx512vl(auVar87,auVar89);
      auVar87 = vfnmadd213ps_avx512vl(auVar218,auVar90,auVar95);
      auVar95 = vmulps_avx512vl(auVar82,auVar89);
      auVar82 = vfnmadd213ps_avx512vl(auVar98,auVar90,auVar95);
      auVar98 = vmulps_avx512vl(auVar88,auVar89);
      auVar84 = vfnmadd231ps_avx512vl(auVar98,auVar84,auVar90);
      auVar95 = vminps_avx(auVar91,auVar85);
      auVar98 = vmaxps_avx(auVar91,auVar85);
      auVar81 = vminps_avx(auVar86,auVar83);
      auVar81 = vminps_avx(auVar95,auVar81);
      auVar95 = vmaxps_avx(auVar86,auVar83);
      auVar98 = vmaxps_avx(auVar98,auVar95);
      auVar96 = vminps_avx(auVar97,auVar87);
      auVar95 = vmaxps_avx(auVar97,auVar87);
      auVar97 = vminps_avx(auVar82,auVar84);
      auVar96 = vminps_avx(auVar96,auVar97);
      auVar96 = vminps_avx(auVar81,auVar96);
      auVar81 = vmaxps_avx(auVar82,auVar84);
      auVar95 = vmaxps_avx(auVar95,auVar81);
      auVar98 = vmaxps_avx(auVar98,auVar95);
      uVar27 = vcmpps_avx512vl(auVar98,local_3e0,5);
      uVar28 = vcmpps_avx512vl(auVar96,local_3c0,2);
      uVar55 = (uint)(bVar47 & (byte)uVar27 & (byte)uVar28);
    }
    if (uVar55 != 0) {
      auStack_5e0[uVar49] = uVar55;
      uVar27 = vmovlps_avx(auVar58);
      *(undefined8 *)(&uStack_460 + uVar49 * 2) = uVar27;
      uVar53 = vmovlps_avx(auVar71);
      auStack_3a0[uVar49] = uVar53;
      uVar49 = (ulong)((int)uVar49 + 1);
    }
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar122 = ZEXT1664(auVar58);
    auVar104._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar104._32_32_ = auVar105._32_32_;
    in_ZMM18 = ZEXT3264(auVar104._0_32_);
    auVar270 = ZEXT464(0x3f800000);
    auVar103._16_48_ = auVar104._16_48_;
    do {
      auVar105._32_32_ = auVar103._32_32_;
      auVar58 = SUB6416(ZEXT464(0xb8d1b717),0);
      if ((int)uVar49 == 0) {
        uVar123 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar32._4_4_ = uVar123;
        auVar32._0_4_ = uVar123;
        auVar32._8_4_ = uVar123;
        auVar32._12_4_ = uVar123;
        uVar27 = vcmpps_avx512vl(local_5d0,auVar32,2);
        uVar54 = (uint)uVar56 & (uint)uVar27;
        uVar56 = (ulong)uVar54;
        if (uVar54 == 0) {
          return;
        }
        goto LAB_01b7ae14;
      }
      uVar48 = (int)uVar49 - 1;
      uVar50 = (ulong)uVar48;
      uVar55 = (&uStack_460)[uVar50 * 2];
      fVar234 = afStack_45c[uVar50 * 2];
      uVar5 = auStack_5e0[uVar50];
      auVar268._8_8_ = 0;
      auVar268._0_8_ = auStack_3a0[uVar50];
      auVar269 = ZEXT1664(auVar268);
      lVar52 = 0;
      for (uVar53 = (ulong)uVar5; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
        lVar52 = lVar52 + 1;
      }
      uVar51 = uVar5 - 1 & uVar5;
      auStack_5e0[uVar50] = uVar51;
      if (uVar51 == 0) {
        uVar49 = (ulong)uVar48;
      }
      auVar141._0_4_ = (float)lVar52;
      auVar141._4_8_ = SUB128(ZEXT812(0),4);
      auVar141._12_4_ = 0;
      auVar69 = vmulss_avx512f(auVar141,SUB6416(ZEXT464(0x3e124925),0));
      lVar52 = lVar52 + 1;
      auVar67 = vmulss_avx512f(ZEXT416((uint)(float)lVar52),SUB6416(ZEXT464(0x3e124925),0));
      auVar62 = auVar270._0_16_;
      auVar66 = vsubss_avx512f(auVar62,auVar69);
      auVar69 = vmulss_avx512f(ZEXT416((uint)fVar234),auVar69);
      auVar66 = vfmadd231ss_avx512f(auVar69,ZEXT416(uVar55),auVar66);
      auVar69 = vsubss_avx512f(auVar62,auVar67);
      auVar69 = vfmadd231ss_fma(ZEXT416((uint)(fVar234 * auVar67._0_4_)),ZEXT416(uVar55),auVar69);
      auVar67 = vsubss_avx512f(auVar69,auVar66);
      vucomiss_avx512f(auVar67);
      if (uVar5 == 0 || lVar52 == 0) break;
      auVar60 = vshufps_avx(auVar268,auVar268,0x50);
      vucomiss_avx512f(auVar67);
      uVar55 = (uint)uVar49;
      auVar254 = auVar272._0_16_;
      auVar71 = vsubps_avx512vl(auVar254,auVar60);
      fVar234 = auVar60._0_4_;
      auVar154._0_4_ = fVar137 * fVar234;
      fVar219 = auVar60._4_4_;
      auVar154._4_4_ = fVar145 * fVar219;
      fVar230 = auVar60._8_4_;
      auVar154._8_4_ = fVar137 * fVar230;
      fVar231 = auVar60._12_4_;
      auVar154._12_4_ = fVar145 * fVar231;
      auVar163._0_4_ = fVar161 * fVar234;
      auVar163._4_4_ = fVar167 * fVar219;
      auVar163._8_4_ = fVar161 * fVar230;
      auVar163._12_4_ = fVar167 * fVar231;
      auVar172._0_4_ = fVar250 * fVar234;
      auVar172._4_4_ = fVar251 * fVar219;
      auVar172._8_4_ = fVar250 * fVar230;
      auVar172._12_4_ = fVar251 * fVar231;
      auVar131._0_4_ = fVar146 * fVar234;
      auVar131._4_4_ = fVar147 * fVar219;
      auVar131._8_4_ = fVar146 * fVar230;
      auVar131._12_4_ = fVar147 * fVar231;
      auVar60 = vfmadd231ps_fma(auVar154,auVar71,local_5f0);
      auVar65 = vfmadd231ps_fma(auVar163,auVar71,local_600);
      auVar79 = vfmadd231ps_fma(auVar172,auVar71,local_610);
      auVar72 = vfmadd231ps_avx512vl(auVar131,auVar129,auVar71);
      auVar85._16_16_ = auVar60;
      auVar85._0_16_ = auVar60;
      auVar88._16_16_ = auVar65;
      auVar88._0_16_ = auVar65;
      auVar90._16_16_ = auVar79;
      auVar90._0_16_ = auVar79;
      uVar123 = auVar66._0_4_;
      auVar91._4_4_ = uVar123;
      auVar91._0_4_ = uVar123;
      auVar91._8_4_ = uVar123;
      auVar91._12_4_ = uVar123;
      uVar123 = auVar69._0_4_;
      auVar91._20_4_ = uVar123;
      auVar91._16_4_ = uVar123;
      auVar91._24_4_ = uVar123;
      auVar91._28_4_ = uVar123;
      auVar98 = vsubps_avx(auVar88,auVar85);
      auVar65 = vfmadd213ps_fma(auVar98,auVar91,auVar85);
      auVar98 = vsubps_avx(auVar90,auVar88);
      auVar71 = vfmadd213ps_fma(auVar98,auVar91,auVar88);
      auVar60 = vsubps_avx(auVar72,auVar79);
      auVar89._16_16_ = auVar60;
      auVar89._0_16_ = auVar60;
      auVar60 = vfmadd213ps_fma(auVar89,auVar91,auVar90);
      auVar98 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar65));
      auVar65 = vfmadd213ps_fma(auVar98,auVar91,ZEXT1632(auVar65));
      auVar98 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar71));
      auVar60 = vfmadd213ps_fma(auVar98,auVar91,ZEXT1632(auVar71));
      auVar98 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar65));
      auVar78 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar98,auVar91);
      auVar105._0_32_ = vmulps_avx512vl(auVar98,in_ZMM18._0_32_);
      auVar103._16_48_ = auVar105._16_48_;
      auVar60 = vmulss_avx512f(auVar67,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar234 = auVar60._0_4_;
      auVar173._0_8_ =
           CONCAT44(auVar78._4_4_ + fVar234 * auVar105._4_4_,
                    auVar78._0_4_ + fVar234 * auVar105._0_4_);
      auVar173._8_4_ = auVar78._8_4_ + fVar234 * auVar105._8_4_;
      auVar173._12_4_ = auVar78._12_4_ + fVar234 * auVar105._12_4_;
      auVar155._0_4_ = fVar234 * auVar105._16_4_;
      auVar155._4_4_ = fVar234 * auVar105._20_4_;
      auVar155._8_4_ = fVar234 * auVar105._24_4_;
      auVar155._12_4_ = fVar234 * auVar105._28_4_;
      auVar168 = vsubps_avx((undefined1  [16])0x0,auVar155);
      auVar76 = vshufpd_avx(auVar78,auVar78,3);
      auVar77 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar60 = vsubps_avx(auVar76,auVar78);
      auVar65 = vsubps_avx(auVar77,(undefined1  [16])0x0);
      auVar190._0_4_ = auVar65._0_4_ + auVar60._0_4_;
      auVar190._4_4_ = auVar65._4_4_ + auVar60._4_4_;
      auVar190._8_4_ = auVar65._8_4_ + auVar60._8_4_;
      auVar190._12_4_ = auVar65._12_4_ + auVar60._12_4_;
      auVar60 = vshufps_avx(auVar78,auVar78,0xb1);
      auVar65 = vshufps_avx(auVar173,auVar173,0xb1);
      auVar79 = vshufps_avx(auVar168,auVar168,0xb1);
      auVar71 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar243._4_4_ = auVar190._0_4_;
      auVar243._0_4_ = auVar190._0_4_;
      auVar243._8_4_ = auVar190._0_4_;
      auVar243._12_4_ = auVar190._0_4_;
      auVar72 = vshufps_avx(auVar190,auVar190,0x55);
      fVar234 = auVar72._0_4_;
      auVar204._0_4_ = auVar60._0_4_ * fVar234;
      fVar219 = auVar72._4_4_;
      auVar204._4_4_ = auVar60._4_4_ * fVar219;
      fVar230 = auVar72._8_4_;
      auVar204._8_4_ = auVar60._8_4_ * fVar230;
      fVar231 = auVar72._12_4_;
      auVar204._12_4_ = auVar60._12_4_ * fVar231;
      auVar216._0_4_ = auVar65._0_4_ * fVar234;
      auVar216._4_4_ = auVar65._4_4_ * fVar219;
      auVar216._8_4_ = auVar65._8_4_ * fVar230;
      auVar216._12_4_ = auVar65._12_4_ * fVar231;
      auVar222._0_4_ = auVar79._0_4_ * fVar234;
      auVar222._4_4_ = auVar79._4_4_ * fVar219;
      auVar222._8_4_ = auVar79._8_4_ * fVar230;
      auVar222._12_4_ = auVar79._12_4_ * fVar231;
      auVar191._0_4_ = auVar71._0_4_ * fVar234;
      auVar191._4_4_ = auVar71._4_4_ * fVar219;
      auVar191._8_4_ = auVar71._8_4_ * fVar230;
      auVar191._12_4_ = auVar71._12_4_ * fVar231;
      auVar60 = vfmadd231ps_fma(auVar204,auVar243,auVar78);
      auVar65 = vfmadd231ps_fma(auVar216,auVar243,auVar173);
      auVar72 = vfmadd231ps_fma(auVar222,auVar243,auVar168);
      auVar177 = vfmadd231ps_fma(auVar191,(undefined1  [16])0x0,auVar243);
      auVar75 = vshufpd_avx(auVar60,auVar60,1);
      auVar73 = vshufpd_avx(auVar65,auVar65,1);
      auVar74 = vshufpd_avx(auVar72,auVar72,1);
      auVar80 = vshufpd_avx(auVar177,auVar177,1);
      auVar79 = vminss_avx(auVar60,auVar65);
      auVar60 = vmaxss_avx(auVar65,auVar60);
      auVar71 = vminss_avx(auVar72,auVar177);
      auVar65 = vmaxss_avx(auVar177,auVar72);
      auVar71 = vminss_avx(auVar79,auVar71);
      auVar60 = vmaxss_avx(auVar65,auVar60);
      auVar72 = vminss_avx(auVar75,auVar73);
      auVar65 = vmaxss_avx(auVar73,auVar75);
      auVar75 = vminss_avx(auVar74,auVar80);
      auVar79 = vmaxss_avx(auVar80,auVar74);
      auVar72 = vminss_avx(auVar72,auVar75);
      auVar65 = vmaxss_avx(auVar79,auVar65);
      vucomiss_avx512f(auVar71);
      if ((uVar55 < 5) || (auVar65 = vucomiss_avx512f(auVar58), uVar55 < 5)) {
        auVar60 = vucomiss_avx512f(auVar58);
        uVar27 = vcmpps_avx512vl(auVar72,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar28 = vcmpps_avx512vl(auVar71,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((4 < uVar55 & ((byte)uVar28 | (byte)uVar27)) != 0) goto LAB_01b7bd53;
        uVar27 = vcmpps_avx512vl(auVar58,auVar65,5);
        uVar28 = vcmpps_avx512vl(auVar72,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar28 | (ushort)uVar27) & 1) == 0) goto LAB_01b7bd53;
        bVar10 = true;
        auVar269 = ZEXT1664(auVar268);
      }
      else {
LAB_01b7bd53:
        auVar75 = auVar275._0_16_;
        uVar27 = vcmpss_avx512f(auVar71,auVar75,1);
        bVar10 = (bool)((byte)uVar27 & 1);
        iVar118 = auVar270._0_4_;
        fVar234 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar118);
        uVar27 = vcmpss_avx512f(auVar60,auVar75,1);
        bVar10 = (bool)((byte)uVar27 & 1);
        fVar219 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar118);
        bVar10 = fVar234 != fVar219;
        iVar274 = auVar275._0_4_;
        auVar103._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar106._4_60_ = auVar103._4_60_;
        auVar106._0_4_ = (uint)bVar10 * iVar274 + (uint)!bVar10 * 0x7f800000;
        auVar79 = auVar106._0_16_;
        auVar108._16_48_ = auVar103._16_48_;
        auVar108._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar107._4_60_ = auVar108._4_60_;
        auVar107._0_4_ = (uint)bVar10 * iVar274 + (uint)!bVar10 * -0x800000;
        auVar58 = auVar107._0_16_;
        uVar27 = vcmpss_avx512f(auVar72,auVar75,1);
        bVar10 = (bool)((byte)uVar27 & 1);
        fVar230 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar118);
        if ((fVar234 != fVar230) || (NAN(fVar234) || NAN(fVar230))) {
          fVar231 = auVar72._0_4_;
          fVar234 = auVar71._0_4_;
          bVar10 = fVar231 == fVar234;
          if ((!bVar10) || (NAN(fVar231) || NAN(fVar234))) {
            auVar31._8_4_ = 0x80000000;
            auVar31._0_8_ = 0x8000000080000000;
            auVar31._12_4_ = 0x80000000;
            auVar71 = vxorps_avx512vl(auVar71,auVar31);
            auVar263._0_4_ = auVar71._0_4_ / (fVar231 - fVar234);
            auVar263._4_12_ = auVar71._4_12_;
            auVar71 = vsubss_avx512f(auVar62,auVar263);
            auVar72 = vfmadd213ss_avx512f(auVar71,auVar75,auVar263);
            auVar71 = auVar72;
          }
          else {
            vucomiss_avx512f(auVar75);
            auVar110._16_48_ = auVar103._16_48_;
            auVar110._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar109._4_60_ = auVar110._4_60_;
            auVar109._0_4_ = (uint)bVar10 * iVar274 + (uint)!bVar10 * 0x7f800000;
            auVar72 = auVar109._0_16_;
            auVar71 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar79 = vminss_avx(auVar79,auVar72);
          auVar58 = vmaxss_avx(auVar71,auVar58);
        }
        auVar269 = ZEXT1664(auVar268);
        uVar27 = vcmpss_avx512f(auVar65,auVar75,1);
        bVar10 = (bool)((byte)uVar27 & 1);
        fVar234 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar118);
        if ((fVar219 != fVar234) || (NAN(fVar219) || NAN(fVar234))) {
          fVar231 = auVar65._0_4_;
          fVar219 = auVar60._0_4_;
          bVar10 = fVar231 == fVar219;
          if ((!bVar10) || (NAN(fVar231) || NAN(fVar219))) {
            auVar30._8_4_ = 0x80000000;
            auVar30._0_8_ = 0x8000000080000000;
            auVar30._12_4_ = 0x80000000;
            auVar60 = vxorps_avx512vl(auVar60,auVar30);
            auVar223._0_4_ = auVar60._0_4_ / (fVar231 - fVar219);
            auVar223._4_12_ = auVar60._4_12_;
            auVar60 = vsubss_avx512f(auVar62,auVar223);
            auVar65 = vfmadd213ss_avx512f(auVar60,auVar75,auVar223);
            auVar60 = auVar65;
          }
          else {
            vucomiss_avx512f(auVar75);
            auVar112._16_48_ = auVar103._16_48_;
            auVar112._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar111._4_60_ = auVar112._4_60_;
            auVar111._0_4_ = (uint)bVar10 * iVar274 + (uint)!bVar10 * 0x7f800000;
            auVar65 = auVar111._0_16_;
            auVar60 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar79 = vminss_avx(auVar79,auVar65);
          auVar58 = vmaxss_avx(auVar60,auVar58);
        }
        bVar10 = fVar230 != fVar234;
        auVar60 = vminss_avx512f(auVar79,auVar62);
        auVar114._16_48_ = auVar103._16_48_;
        auVar114._0_16_ = auVar79;
        auVar113._4_60_ = auVar114._4_60_;
        auVar113._0_4_ = (uint)bVar10 * auVar60._0_4_ + (uint)!bVar10 * auVar79._0_4_;
        auVar60 = vmaxss_avx512f(auVar62,auVar58);
        auVar116._16_48_ = auVar103._16_48_;
        auVar116._0_16_ = auVar58;
        auVar115._4_60_ = auVar116._4_60_;
        auVar115._0_4_ = (uint)bVar10 * auVar60._0_4_ + (uint)!bVar10 * auVar58._0_4_;
        auVar58 = vmaxss_avx512f(auVar75,auVar113._0_16_);
        auVar60 = vminss_avx512f(auVar115._0_16_,auVar62);
        bVar10 = true;
        if (auVar58._0_4_ <= auVar60._0_4_) {
          auVar73 = vmaxss_avx512f(auVar75,ZEXT416((uint)(auVar58._0_4_ + -0.1)));
          auVar74 = vminss_avx512f(ZEXT416((uint)(auVar60._0_4_ + 0.1)),auVar62);
          auVar132._0_8_ = auVar78._0_8_;
          auVar132._8_8_ = auVar132._0_8_;
          auVar217._8_8_ = auVar173._0_8_;
          auVar217._0_8_ = auVar173._0_8_;
          auVar224._8_8_ = auVar168._0_8_;
          auVar224._0_8_ = auVar168._0_8_;
          auVar58 = vshufpd_avx(auVar173,auVar173,3);
          auVar60 = vshufpd_avx(auVar168,auVar168,3);
          auVar65 = vshufps_avx(auVar73,auVar74,0);
          auVar75 = vsubps_avx512vl(auVar254,auVar65);
          fVar234 = auVar65._0_4_;
          auVar258._0_4_ = fVar234 * auVar76._0_4_;
          fVar219 = auVar65._4_4_;
          auVar258._4_4_ = fVar219 * auVar76._4_4_;
          fVar230 = auVar65._8_4_;
          auVar258._8_4_ = fVar230 * auVar76._8_4_;
          fVar231 = auVar65._12_4_;
          auVar258._12_4_ = fVar231 * auVar76._12_4_;
          auVar174._0_4_ = fVar234 * auVar58._0_4_;
          auVar174._4_4_ = fVar219 * auVar58._4_4_;
          auVar174._8_4_ = fVar230 * auVar58._8_4_;
          auVar174._12_4_ = fVar231 * auVar58._12_4_;
          auVar185._0_4_ = fVar234 * auVar60._0_4_;
          auVar185._4_4_ = fVar219 * auVar60._4_4_;
          auVar185._8_4_ = fVar230 * auVar60._8_4_;
          auVar185._12_4_ = fVar231 * auVar60._12_4_;
          auVar156._0_4_ = fVar234 * auVar77._0_4_;
          auVar156._4_4_ = fVar219 * auVar77._4_4_;
          auVar156._8_4_ = fVar230 * auVar77._8_4_;
          auVar156._12_4_ = fVar231 * auVar77._12_4_;
          auVar79 = vfmadd231ps_fma(auVar258,auVar75,auVar132);
          auVar71 = vfmadd231ps_fma(auVar174,auVar75,auVar217);
          auVar72 = vfmadd231ps_fma(auVar185,auVar75,auVar224);
          auVar75 = vfmadd231ps_fma(auVar156,auVar75,ZEXT816(0));
          auVar60 = vsubss_avx512f(auVar62,auVar73);
          auVar58 = vmovshdup_avx(auVar268);
          auVar168 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * auVar73._0_4_)),auVar268,auVar60
                                    );
          auVar60 = vsubss_avx512f(auVar62,auVar74);
          auVar177 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar58._0_4_)),auVar268,auVar60
                                    );
          auVar76 = vdivss_avx512f(auVar62,auVar67);
          auVar58 = vsubps_avx(auVar71,auVar79);
          auVar142._0_4_ = auVar58._0_4_ * 3.0;
          auVar142._4_4_ = auVar58._4_4_ * 3.0;
          auVar142._8_4_ = auVar58._8_4_ * 3.0;
          auVar142._12_4_ = auVar58._12_4_ * 3.0;
          auVar58 = vsubps_avx(auVar72,auVar71);
          auVar192._0_4_ = auVar58._0_4_ * 3.0;
          auVar192._4_4_ = auVar58._4_4_ * 3.0;
          auVar192._8_4_ = auVar58._8_4_ * 3.0;
          auVar192._12_4_ = auVar58._12_4_ * 3.0;
          auVar58 = vsubps_avx(auVar75,auVar72);
          auVar205._0_4_ = auVar58._0_4_ * 3.0;
          auVar205._4_4_ = auVar58._4_4_ * 3.0;
          auVar205._8_4_ = auVar58._8_4_ * 3.0;
          auVar205._12_4_ = auVar58._12_4_ * 3.0;
          auVar67 = vminps_avx(auVar192,auVar205);
          auVar58 = vmaxps_avx(auVar192,auVar205);
          auVar67 = vminps_avx(auVar142,auVar67);
          auVar58 = vmaxps_avx(auVar142,auVar58);
          auVar60 = vshufpd_avx(auVar67,auVar67,3);
          auVar65 = vshufpd_avx(auVar58,auVar58,3);
          auVar67 = vminps_avx(auVar67,auVar60);
          auVar58 = vmaxps_avx(auVar58,auVar65);
          fVar234 = auVar76._0_4_;
          auVar206._0_4_ = fVar234 * auVar67._0_4_;
          auVar206._4_4_ = fVar234 * auVar67._4_4_;
          auVar206._8_4_ = fVar234 * auVar67._8_4_;
          auVar206._12_4_ = fVar234 * auVar67._12_4_;
          auVar193._0_4_ = fVar234 * auVar58._0_4_;
          auVar193._4_4_ = fVar234 * auVar58._4_4_;
          auVar193._8_4_ = fVar234 * auVar58._8_4_;
          auVar193._12_4_ = fVar234 * auVar58._12_4_;
          auVar76 = vdivss_avx512f(auVar62,ZEXT416((uint)(auVar177._0_4_ - auVar168._0_4_)));
          auVar58 = vshufpd_avx(auVar79,auVar79,3);
          auVar67 = vshufpd_avx(auVar71,auVar71,3);
          auVar60 = vshufpd_avx(auVar72,auVar72,3);
          auVar65 = vshufpd_avx(auVar75,auVar75,3);
          auVar58 = vsubps_avx(auVar58,auVar79);
          auVar79 = vsubps_avx(auVar67,auVar71);
          auVar71 = vsubps_avx(auVar60,auVar72);
          auVar65 = vsubps_avx(auVar65,auVar75);
          auVar67 = vminps_avx(auVar58,auVar79);
          auVar58 = vmaxps_avx(auVar58,auVar79);
          auVar60 = vminps_avx(auVar71,auVar65);
          auVar60 = vminps_avx(auVar67,auVar60);
          auVar67 = vmaxps_avx(auVar71,auVar65);
          auVar58 = vmaxps_avx(auVar58,auVar67);
          fVar234 = auVar76._0_4_;
          auVar225._0_4_ = fVar234 * auVar60._0_4_;
          auVar225._4_4_ = fVar234 * auVar60._4_4_;
          auVar225._8_4_ = fVar234 * auVar60._8_4_;
          auVar225._12_4_ = fVar234 * auVar60._12_4_;
          auVar236._0_4_ = fVar234 * auVar58._0_4_;
          auVar236._4_4_ = fVar234 * auVar58._4_4_;
          auVar236._8_4_ = fVar234 * auVar58._8_4_;
          auVar236._12_4_ = fVar234 * auVar58._12_4_;
          auVar80 = vinsertps_avx512f(auVar66,auVar168,0x10);
          auVar79 = vinsertps_avx(auVar69,auVar177,0x10);
          auVar121._0_4_ = auVar80._0_4_ + auVar79._0_4_;
          auVar121._4_4_ = auVar80._4_4_ + auVar79._4_4_;
          auVar121._8_4_ = auVar80._8_4_ + auVar79._8_4_;
          auVar121._12_4_ = auVar80._12_4_ + auVar79._12_4_;
          auVar73 = vmulps_avx512vl(auVar121,auVar122._0_16_);
          auVar60 = vshufps_avx(auVar73,auVar73,0x54);
          uVar123 = auVar73._0_4_;
          auVar143._4_4_ = uVar123;
          auVar143._0_4_ = uVar123;
          auVar143._8_4_ = uVar123;
          auVar143._12_4_ = uVar123;
          auVar71 = vfmadd213ps_avx512vl(auVar57,auVar143,auVar59);
          auVar67 = vfmadd213ps_fma(local_470,auVar143,auVar70);
          auVar65 = vfmadd213ps_fma(local_480,auVar143,auVar68);
          auVar58 = vsubps_avx(auVar67,auVar71);
          auVar71 = vfmadd213ps_fma(auVar58,auVar143,auVar71);
          auVar58 = vsubps_avx(auVar65,auVar67);
          auVar58 = vfmadd213ps_fma(auVar58,auVar143,auVar67);
          auVar58 = vsubps_avx(auVar58,auVar71);
          auVar67 = vfmadd231ps_fma(auVar71,auVar58,auVar143);
          auVar144._0_8_ = CONCAT44(auVar58._4_4_ * 3.0,auVar58._0_4_ * 3.0);
          auVar144._8_4_ = auVar58._8_4_ * 3.0;
          auVar144._12_4_ = auVar58._12_4_ * 3.0;
          auVar244._8_8_ = auVar67._0_8_;
          auVar244._0_8_ = auVar67._0_8_;
          auVar58 = vshufpd_avx(auVar67,auVar67,3);
          auVar67 = vshufps_avx(auVar73,auVar73,0x55);
          auVar65 = vsubps_avx(auVar58,auVar244);
          auVar71 = vfmadd231ps_fma(auVar244,auVar67,auVar65);
          auVar264._8_8_ = auVar144._0_8_;
          auVar264._0_8_ = auVar144._0_8_;
          auVar58 = vshufpd_avx(auVar144,auVar144,3);
          auVar58 = vsubps_avx(auVar58,auVar264);
          auVar67 = vfmadd213ps_fma(auVar58,auVar67,auVar264);
          auVar72 = vxorps_avx512vl(auVar65,auVar273._0_16_);
          auVar58 = vmovshdup_avx(auVar67);
          auVar75 = vxorps_avx512vl(auVar58,auVar273._0_16_);
          auVar76 = vmovshdup_avx512vl(auVar65);
          auVar75 = vpermt2ps_avx512vl(auVar75,ZEXT416(5),auVar65);
          auVar58 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar58._0_4_ * auVar65._0_4_)),auVar67,
                                        auVar76);
          auVar67 = vpermt2ps_avx512vl(auVar67,SUB6416(ZEXT464(4),0),auVar72);
          auVar157._0_4_ = auVar58._0_4_;
          auVar157._4_4_ = auVar157._0_4_;
          auVar157._8_4_ = auVar157._0_4_;
          auVar157._12_4_ = auVar157._0_4_;
          auVar58 = vdivps_avx(auVar75,auVar157);
          auVar67 = vdivps_avx(auVar67,auVar157);
          fVar219 = auVar71._0_4_;
          auVar65 = vshufps_avx(auVar71,auVar71,0x55);
          fVar234 = auVar67._0_4_;
          auVar245._0_4_ = fVar219 * auVar58._0_4_ + auVar65._0_4_ * fVar234;
          auVar245._4_4_ = fVar219 * auVar58._4_4_ + auVar65._4_4_ * auVar67._4_4_;
          auVar245._8_4_ = fVar219 * auVar58._8_4_ + auVar65._8_4_ * auVar67._8_4_;
          auVar245._12_4_ = fVar219 * auVar58._12_4_ + auVar65._12_4_ * auVar67._12_4_;
          auVar74 = vsubps_avx(auVar60,auVar245);
          auVar71 = vmovshdup_avx(auVar58);
          auVar60 = vinsertps_avx(auVar206,auVar225,0x1c);
          auVar265._0_4_ = auVar71._0_4_ * auVar60._0_4_;
          auVar265._4_4_ = auVar71._4_4_ * auVar60._4_4_;
          auVar265._8_4_ = auVar71._8_4_ * auVar60._8_4_;
          auVar265._12_4_ = auVar71._12_4_ * auVar60._12_4_;
          auVar65 = vinsertps_avx(auVar193,auVar236,0x1c);
          auVar246._0_4_ = auVar71._0_4_ * auVar65._0_4_;
          auVar246._4_4_ = auVar71._4_4_ * auVar65._4_4_;
          auVar246._8_4_ = auVar71._8_4_ * auVar65._8_4_;
          auVar246._12_4_ = auVar71._12_4_ * auVar65._12_4_;
          auVar77 = vminps_avx512vl(auVar265,auVar246);
          auVar75 = vmaxps_avx(auVar246,auVar265);
          auVar76 = vmovshdup_avx(auVar67);
          auVar71 = vinsertps_avx(auVar225,auVar206,0x4c);
          auVar226._0_4_ = auVar76._0_4_ * auVar71._0_4_;
          auVar226._4_4_ = auVar76._4_4_ * auVar71._4_4_;
          auVar226._8_4_ = auVar76._8_4_ * auVar71._8_4_;
          auVar226._12_4_ = auVar76._12_4_ * auVar71._12_4_;
          auVar72 = vinsertps_avx(auVar236,auVar193,0x4c);
          auVar237._0_4_ = auVar76._0_4_ * auVar72._0_4_;
          auVar237._4_4_ = auVar76._4_4_ * auVar72._4_4_;
          auVar237._8_4_ = auVar76._8_4_ * auVar72._8_4_;
          auVar237._12_4_ = auVar76._12_4_ * auVar72._12_4_;
          auVar76 = vminps_avx(auVar226,auVar237);
          auVar77 = vaddps_avx512vl(auVar77,auVar76);
          auVar76 = vmaxps_avx(auVar237,auVar226);
          auVar227._0_4_ = auVar75._0_4_ + auVar76._0_4_;
          auVar227._4_4_ = auVar75._4_4_ + auVar76._4_4_;
          auVar227._8_4_ = auVar75._8_4_ + auVar76._8_4_;
          auVar227._12_4_ = auVar75._12_4_ + auVar76._12_4_;
          auVar238._8_8_ = 0x3f80000000000000;
          auVar238._0_8_ = 0x3f80000000000000;
          auVar75 = vsubps_avx(auVar238,auVar227);
          auVar76 = vsubps_avx(auVar238,auVar77);
          auVar77 = vsubps_avx(auVar80,auVar73);
          auVar73 = vsubps_avx(auVar79,auVar73);
          fVar233 = auVar77._0_4_;
          auVar266._0_4_ = fVar233 * auVar75._0_4_;
          fVar241 = auVar77._4_4_;
          auVar266._4_4_ = fVar241 * auVar75._4_4_;
          fVar252 = auVar77._8_4_;
          auVar266._8_4_ = fVar252 * auVar75._8_4_;
          fVar253 = auVar77._12_4_;
          auVar266._12_4_ = fVar253 * auVar75._12_4_;
          auVar78 = vbroadcastss_avx512vl(auVar58);
          auVar60 = vmulps_avx512vl(auVar78,auVar60);
          auVar65 = vmulps_avx512vl(auVar78,auVar65);
          auVar78 = vminps_avx512vl(auVar60,auVar65);
          auVar60 = vmaxps_avx(auVar65,auVar60);
          auVar207._0_4_ = fVar234 * auVar71._0_4_;
          auVar207._4_4_ = fVar234 * auVar71._4_4_;
          auVar207._8_4_ = fVar234 * auVar71._8_4_;
          auVar207._12_4_ = fVar234 * auVar71._12_4_;
          auVar194._0_4_ = fVar234 * auVar72._0_4_;
          auVar194._4_4_ = fVar234 * auVar72._4_4_;
          auVar194._8_4_ = fVar234 * auVar72._8_4_;
          auVar194._12_4_ = fVar234 * auVar72._12_4_;
          auVar65 = vminps_avx(auVar207,auVar194);
          auVar71 = vaddps_avx512vl(auVar78,auVar65);
          auVar72 = vmulps_avx512vl(auVar77,auVar76);
          fVar219 = auVar73._0_4_;
          auVar228._0_4_ = fVar219 * auVar75._0_4_;
          fVar230 = auVar73._4_4_;
          auVar228._4_4_ = fVar230 * auVar75._4_4_;
          fVar231 = auVar73._8_4_;
          auVar228._8_4_ = fVar231 * auVar75._8_4_;
          fVar232 = auVar73._12_4_;
          auVar228._12_4_ = fVar232 * auVar75._12_4_;
          auVar239._0_4_ = fVar219 * auVar76._0_4_;
          auVar239._4_4_ = fVar230 * auVar76._4_4_;
          auVar239._8_4_ = fVar231 * auVar76._8_4_;
          auVar239._12_4_ = fVar232 * auVar76._12_4_;
          auVar65 = vmaxps_avx(auVar194,auVar207);
          auVar195._0_4_ = auVar60._0_4_ + auVar65._0_4_;
          auVar195._4_4_ = auVar60._4_4_ + auVar65._4_4_;
          auVar195._8_4_ = auVar60._8_4_ + auVar65._8_4_;
          auVar195._12_4_ = auVar60._12_4_ + auVar65._12_4_;
          auVar208._8_8_ = 0x3f800000;
          auVar208._0_8_ = 0x3f800000;
          auVar60 = vsubps_avx(auVar208,auVar195);
          auVar65 = vsubps_avx(auVar208,auVar71);
          auVar259._0_4_ = fVar233 * auVar60._0_4_;
          auVar259._4_4_ = fVar241 * auVar60._4_4_;
          auVar259._8_4_ = fVar252 * auVar60._8_4_;
          auVar259._12_4_ = fVar253 * auVar60._12_4_;
          auVar247._0_4_ = fVar233 * auVar65._0_4_;
          auVar247._4_4_ = fVar241 * auVar65._4_4_;
          auVar247._8_4_ = fVar252 * auVar65._8_4_;
          auVar247._12_4_ = fVar253 * auVar65._12_4_;
          auVar196._0_4_ = fVar219 * auVar60._0_4_;
          auVar196._4_4_ = fVar230 * auVar60._4_4_;
          auVar196._8_4_ = fVar231 * auVar60._8_4_;
          auVar196._12_4_ = fVar232 * auVar60._12_4_;
          auVar209._0_4_ = fVar219 * auVar65._0_4_;
          auVar209._4_4_ = fVar230 * auVar65._4_4_;
          auVar209._8_4_ = fVar231 * auVar65._8_4_;
          auVar209._12_4_ = fVar232 * auVar65._12_4_;
          auVar60 = vminps_avx(auVar259,auVar247);
          auVar65 = vminps_avx(auVar196,auVar209);
          auVar71 = vminps_avx(auVar60,auVar65);
          auVar60 = vmaxps_avx(auVar247,auVar259);
          auVar65 = vmaxps_avx(auVar209,auVar196);
          auVar65 = vmaxps_avx(auVar65,auVar60);
          auVar75 = vminps_avx512vl(auVar266,auVar72);
          auVar60 = vminps_avx(auVar228,auVar239);
          auVar60 = vminps_avx(auVar75,auVar60);
          auVar60 = vhaddps_avx(auVar71,auVar60);
          auVar72 = vmaxps_avx512vl(auVar72,auVar266);
          auVar71 = vmaxps_avx(auVar239,auVar228);
          auVar71 = vmaxps_avx(auVar71,auVar72);
          auVar65 = vhaddps_avx(auVar65,auVar71);
          auVar60 = vshufps_avx(auVar60,auVar60,0xe8);
          auVar65 = vshufps_avx(auVar65,auVar65,0xe8);
          auVar197._0_4_ = auVar60._0_4_ + auVar74._0_4_;
          auVar197._4_4_ = auVar60._4_4_ + auVar74._4_4_;
          auVar197._8_4_ = auVar60._8_4_ + auVar74._8_4_;
          auVar197._12_4_ = auVar60._12_4_ + auVar74._12_4_;
          auVar210._0_4_ = auVar65._0_4_ + auVar74._0_4_;
          auVar210._4_4_ = auVar65._4_4_ + auVar74._4_4_;
          auVar210._8_4_ = auVar65._8_4_ + auVar74._8_4_;
          auVar210._12_4_ = auVar65._12_4_ + auVar74._12_4_;
          auVar60 = vmaxps_avx(auVar80,auVar197);
          auVar65 = vminps_avx(auVar210,auVar79);
          uVar53 = vcmpps_avx512vl(auVar65,auVar60,1);
          auVar60 = vinsertps_avx(auVar168,auVar177,0x10);
          auVar269 = ZEXT1664(auVar60);
          auVar65 = ZEXT416(5);
          if ((uVar53 & 3) == 0) {
            vucomiss_avx512f(auVar66);
            auVar65 = vxorps_avx512vl(auVar65,auVar65);
            auVar275 = ZEXT1664(auVar65);
            if (uVar55 < 4 && (uVar5 == 0 || lVar52 == 0)) {
              bVar10 = false;
            }
            else {
              lVar52 = 200;
              do {
                auVar79 = vsubss_avx512f(auVar62,auVar74);
                fVar231 = auVar79._0_4_;
                fVar219 = fVar231 * fVar231 * fVar231;
                fVar232 = auVar74._0_4_;
                fVar230 = fVar232 * 3.0 * fVar231 * fVar231;
                fVar231 = fVar231 * fVar232 * fVar232 * 3.0;
                auVar175._4_4_ = fVar219;
                auVar175._0_4_ = fVar219;
                auVar175._8_4_ = fVar219;
                auVar175._12_4_ = fVar219;
                auVar164._4_4_ = fVar230;
                auVar164._0_4_ = fVar230;
                auVar164._8_4_ = fVar230;
                auVar164._12_4_ = fVar230;
                auVar133._4_4_ = fVar231;
                auVar133._0_4_ = fVar231;
                auVar133._8_4_ = fVar231;
                auVar133._12_4_ = fVar231;
                fVar232 = fVar232 * fVar232 * fVar232;
                auVar186._0_4_ = (float)local_620._0_4_ * fVar232;
                auVar186._4_4_ = (float)local_620._4_4_ * fVar232;
                auVar186._8_4_ = fStack_618 * fVar232;
                auVar186._12_4_ = fStack_614 * fVar232;
                auVar79 = vfmadd231ps_fma(auVar186,auVar68,auVar133);
                auVar79 = vfmadd231ps_fma(auVar79,auVar70,auVar164);
                auVar79 = vfmadd231ps_fma(auVar79,auVar59,auVar175);
                auVar134._8_8_ = auVar79._0_8_;
                auVar134._0_8_ = auVar79._0_8_;
                auVar79 = vshufpd_avx(auVar79,auVar79,3);
                auVar71 = vshufps_avx(auVar74,auVar74,0x55);
                auVar79 = vsubps_avx(auVar79,auVar134);
                auVar71 = vfmadd213ps_fma(auVar79,auVar71,auVar134);
                fVar219 = auVar71._0_4_;
                auVar79 = vshufps_avx(auVar71,auVar71,0x55);
                auVar135._0_4_ = auVar58._0_4_ * fVar219 + fVar234 * auVar79._0_4_;
                auVar135._4_4_ = auVar58._4_4_ * fVar219 + auVar67._4_4_ * auVar79._4_4_;
                auVar135._8_4_ = auVar58._8_4_ * fVar219 + auVar67._8_4_ * auVar79._8_4_;
                auVar135._12_4_ = auVar58._12_4_ * fVar219 + auVar67._12_4_ * auVar79._12_4_;
                auVar74 = vsubps_avx(auVar74,auVar135);
                auVar79 = vandps_avx512vl(auVar71,auVar271._0_16_);
                auVar71 = vprolq_avx512vl(auVar79,0x20);
                auVar79 = vmaxss_avx(auVar71,auVar79);
                bVar25 = auVar79._0_4_ <= (float)local_630._0_4_;
                if (auVar79._0_4_ < (float)local_630._0_4_) {
                  auVar58 = vucomiss_avx512f(auVar65);
                  if (bVar25) {
                    auVar67 = vucomiss_avx512f(auVar58);
                    auVar270 = ZEXT1664(auVar67);
                    if (bVar25) {
                      vmovshdup_avx(auVar58);
                      auVar67 = vucomiss_avx512f(auVar65);
                      if (bVar25) {
                        auVar62 = vucomiss_avx512f(auVar67);
                        auVar270 = ZEXT1664(auVar62);
                        if (bVar25) {
                          auVar79 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar74 = vinsertps_avx(auVar79,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar79 = vdpps_avx(auVar74,local_490,0x7f);
                          auVar71 = vdpps_avx(auVar74,local_4a0,0x7f);
                          auVar72 = vdpps_avx(auVar74,local_4b0,0x7f);
                          auVar75 = vdpps_avx(auVar74,local_4c0,0x7f);
                          auVar76 = vdpps_avx(auVar74,local_4d0,0x7f);
                          auVar77 = vdpps_avx(auVar74,local_4e0,0x7f);
                          auVar73 = vdpps_avx(auVar74,local_4f0,0x7f);
                          auVar74 = vdpps_avx(auVar74,local_500,0x7f);
                          auVar80 = vsubss_avx512f(auVar62,auVar67);
                          fVar232 = auVar67._0_4_;
                          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar232 * auVar76._0_4_)),auVar80
                                                    ,auVar79);
                          auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar77._0_4_ * fVar232)),auVar80
                                                    ,auVar71);
                          auVar71 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * fVar232)),auVar80
                                                    ,auVar72);
                          auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar232 * auVar74._0_4_)),auVar80
                                                    ,auVar75);
                          auVar62 = vsubss_avx512f(auVar62,auVar58);
                          auVar198._0_4_ = auVar62._0_4_;
                          fVar234 = auVar198._0_4_ * auVar198._0_4_ * auVar198._0_4_;
                          fVar231 = auVar58._0_4_;
                          fVar219 = fVar231 * 3.0 * auVar198._0_4_ * auVar198._0_4_;
                          fVar230 = auVar198._0_4_ * fVar231 * fVar231 * 3.0;
                          fVar241 = fVar231 * fVar231 * fVar231;
                          auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 * auVar72._0_4_)),
                                                    ZEXT416((uint)fVar230),auVar71);
                          auVar62 = vfmadd231ss_fma(auVar62,ZEXT416((uint)fVar219),auVar79);
                          auVar67 = vfmadd231ss_fma(auVar62,ZEXT416((uint)fVar234),auVar67);
                          fVar233 = auVar67._0_4_;
                          if ((fVar119 <= fVar233) &&
                             (fVar252 = *(float *)(ray + k * 4 + 0x200), fVar233 <= fVar252)) {
                            auVar67 = vshufps_avx(auVar58,auVar58,0x55);
                            auVar71 = vsubps_avx512vl(auVar254,auVar67);
                            fVar253 = auVar67._0_4_;
                            auVar229._0_4_ = fVar253 * (float)local_520._0_4_;
                            fVar260 = auVar67._4_4_;
                            auVar229._4_4_ = fVar260 * (float)local_520._4_4_;
                            fVar261 = auVar67._8_4_;
                            auVar229._8_4_ = fVar261 * fStack_518;
                            fVar262 = auVar67._12_4_;
                            auVar229._12_4_ = fVar262 * fStack_514;
                            auVar240._0_4_ = fVar253 * (float)local_570._0_4_;
                            auVar240._4_4_ = fVar260 * (float)local_570._4_4_;
                            auVar240._8_4_ = fVar261 * fStack_568;
                            auVar240._12_4_ = fVar262 * fStack_564;
                            auVar248._0_4_ = fVar253 * (float)local_580._0_4_;
                            auVar248._4_4_ = fVar260 * (float)local_580._4_4_;
                            auVar248._8_4_ = fVar261 * fStack_578;
                            auVar248._12_4_ = fVar262 * fStack_574;
                            auVar211._0_4_ = fVar253 * (float)local_540._0_4_;
                            auVar211._4_4_ = fVar260 * (float)local_540._4_4_;
                            auVar211._8_4_ = fVar261 * fStack_538;
                            auVar211._12_4_ = fVar262 * fStack_534;
                            auVar67 = vfmadd231ps_fma(auVar229,auVar71,local_510);
                            auVar62 = vfmadd231ps_fma(auVar240,auVar71,local_550);
                            auVar79 = vfmadd231ps_fma(auVar248,auVar71,local_560);
                            auVar71 = vfmadd231ps_fma(auVar211,auVar71,local_530);
                            auVar67 = vsubps_avx(auVar62,auVar67);
                            auVar62 = vsubps_avx(auVar79,auVar62);
                            auVar79 = vsubps_avx(auVar71,auVar79);
                            auVar249._0_4_ = fVar231 * auVar62._0_4_;
                            auVar249._4_4_ = fVar231 * auVar62._4_4_;
                            auVar249._8_4_ = fVar231 * auVar62._8_4_;
                            auVar249._12_4_ = fVar231 * auVar62._12_4_;
                            auVar198._4_4_ = auVar198._0_4_;
                            auVar198._8_4_ = auVar198._0_4_;
                            auVar198._12_4_ = auVar198._0_4_;
                            auVar67 = vfmadd231ps_fma(auVar249,auVar198,auVar67);
                            auVar212._0_4_ = fVar231 * auVar79._0_4_;
                            auVar212._4_4_ = fVar231 * auVar79._4_4_;
                            auVar212._8_4_ = fVar231 * auVar79._8_4_;
                            auVar212._12_4_ = fVar231 * auVar79._12_4_;
                            auVar62 = vfmadd231ps_fma(auVar212,auVar198,auVar62);
                            auVar213._0_4_ = fVar231 * auVar62._0_4_;
                            auVar213._4_4_ = fVar231 * auVar62._4_4_;
                            auVar213._8_4_ = fVar231 * auVar62._8_4_;
                            auVar213._12_4_ = fVar231 * auVar62._12_4_;
                            auVar67 = vfmadd231ps_fma(auVar213,auVar198,auVar67);
                            auVar29._8_4_ = 0x40400000;
                            auVar29._0_8_ = 0x4040000040400000;
                            auVar29._12_4_ = 0x40400000;
                            auVar67 = vmulps_avx512vl(auVar67,auVar29);
                            pGVar6 = (context->scene->geometries).items[uVar54].ptr;
                            if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                              auVar187._0_4_ = fVar241 * (float)local_5c0._0_4_;
                              auVar187._4_4_ = fVar241 * (float)local_5c0._4_4_;
                              auVar187._8_4_ = fVar241 * fStack_5b8;
                              auVar187._12_4_ = fVar241 * fStack_5b4;
                              auVar176._4_4_ = fVar230;
                              auVar176._0_4_ = fVar230;
                              auVar176._8_4_ = fVar230;
                              auVar176._12_4_ = fVar230;
                              auVar62 = vfmadd132ps_fma(auVar176,auVar187,local_5b0);
                              auVar165._4_4_ = fVar219;
                              auVar165._0_4_ = fVar219;
                              auVar165._8_4_ = fVar219;
                              auVar165._12_4_ = fVar219;
                              auVar62 = vfmadd132ps_fma(auVar165,auVar62,local_5a0);
                              auVar158._4_4_ = fVar234;
                              auVar158._0_4_ = fVar234;
                              auVar158._8_4_ = fVar234;
                              auVar158._12_4_ = fVar234;
                              auVar71 = vfmadd132ps_fma(auVar158,auVar62,local_590);
                              auVar62 = vshufps_avx(auVar71,auVar71,0xc9);
                              auVar79 = vshufps_avx(auVar67,auVar67,0xc9);
                              auVar159._0_4_ = auVar71._0_4_ * auVar79._0_4_;
                              auVar159._4_4_ = auVar71._4_4_ * auVar79._4_4_;
                              auVar159._8_4_ = auVar71._8_4_ * auVar79._8_4_;
                              auVar159._12_4_ = auVar71._12_4_ * auVar79._12_4_;
                              auVar67 = vfmsub231ps_fma(auVar159,auVar67,auVar62);
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                *(float *)(ray + k * 4 + 0x200) = fVar233;
                                uVar123 = vextractps_avx(auVar67,1);
                                *(undefined4 *)(ray + k * 4 + 0x300) = uVar123;
                                uVar123 = vextractps_avx(auVar67,2);
                                *(undefined4 *)(ray + k * 4 + 0x340) = uVar123;
                                *(int *)(ray + k * 4 + 0x380) = auVar67._0_4_;
                                *(float *)(ray + k * 4 + 0x3c0) = fVar231;
                                *(float *)(ray + k * 4 + 0x400) = fVar232;
                                *(uint *)(ray + k * 4 + 0x440) = uVar4;
                                *(uint *)(ray + k * 4 + 0x480) = uVar54;
                                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                              }
                              else {
                                local_200 = vbroadcastss_avx512f(auVar58);
                                auVar103 = vbroadcastss_avx512f(ZEXT416(1));
                                local_1c0 = vpermps_avx512f(auVar103,ZEXT1664(auVar58));
                                auVar103 = vpermps_avx512f(auVar103,ZEXT1664(auVar67));
                                auVar272 = vbroadcastss_avx512f(ZEXT416(2));
                                local_280 = vpermps_avx512f(auVar272,ZEXT1664(auVar67));
                                local_240 = vbroadcastss_avx512f(auVar67);
                                local_2c0[0] = (RTCHitN)auVar103[0];
                                local_2c0[1] = (RTCHitN)auVar103[1];
                                local_2c0[2] = (RTCHitN)auVar103[2];
                                local_2c0[3] = (RTCHitN)auVar103[3];
                                local_2c0[4] = (RTCHitN)auVar103[4];
                                local_2c0[5] = (RTCHitN)auVar103[5];
                                local_2c0[6] = (RTCHitN)auVar103[6];
                                local_2c0[7] = (RTCHitN)auVar103[7];
                                local_2c0[8] = (RTCHitN)auVar103[8];
                                local_2c0[9] = (RTCHitN)auVar103[9];
                                local_2c0[10] = (RTCHitN)auVar103[10];
                                local_2c0[0xb] = (RTCHitN)auVar103[0xb];
                                local_2c0[0xc] = (RTCHitN)auVar103[0xc];
                                local_2c0[0xd] = (RTCHitN)auVar103[0xd];
                                local_2c0[0xe] = (RTCHitN)auVar103[0xe];
                                local_2c0[0xf] = (RTCHitN)auVar103[0xf];
                                local_2c0[0x10] = (RTCHitN)auVar103[0x10];
                                local_2c0[0x11] = (RTCHitN)auVar103[0x11];
                                local_2c0[0x12] = (RTCHitN)auVar103[0x12];
                                local_2c0[0x13] = (RTCHitN)auVar103[0x13];
                                local_2c0[0x14] = (RTCHitN)auVar103[0x14];
                                local_2c0[0x15] = (RTCHitN)auVar103[0x15];
                                local_2c0[0x16] = (RTCHitN)auVar103[0x16];
                                local_2c0[0x17] = (RTCHitN)auVar103[0x17];
                                local_2c0[0x18] = (RTCHitN)auVar103[0x18];
                                local_2c0[0x19] = (RTCHitN)auVar103[0x19];
                                local_2c0[0x1a] = (RTCHitN)auVar103[0x1a];
                                local_2c0[0x1b] = (RTCHitN)auVar103[0x1b];
                                local_2c0[0x1c] = (RTCHitN)auVar103[0x1c];
                                local_2c0[0x1d] = (RTCHitN)auVar103[0x1d];
                                local_2c0[0x1e] = (RTCHitN)auVar103[0x1e];
                                local_2c0[0x1f] = (RTCHitN)auVar103[0x1f];
                                local_2c0[0x20] = (RTCHitN)auVar103[0x20];
                                local_2c0[0x21] = (RTCHitN)auVar103[0x21];
                                local_2c0[0x22] = (RTCHitN)auVar103[0x22];
                                local_2c0[0x23] = (RTCHitN)auVar103[0x23];
                                local_2c0[0x24] = (RTCHitN)auVar103[0x24];
                                local_2c0[0x25] = (RTCHitN)auVar103[0x25];
                                local_2c0[0x26] = (RTCHitN)auVar103[0x26];
                                local_2c0[0x27] = (RTCHitN)auVar103[0x27];
                                local_2c0[0x28] = (RTCHitN)auVar103[0x28];
                                local_2c0[0x29] = (RTCHitN)auVar103[0x29];
                                local_2c0[0x2a] = (RTCHitN)auVar103[0x2a];
                                local_2c0[0x2b] = (RTCHitN)auVar103[0x2b];
                                local_2c0[0x2c] = (RTCHitN)auVar103[0x2c];
                                local_2c0[0x2d] = (RTCHitN)auVar103[0x2d];
                                local_2c0[0x2e] = (RTCHitN)auVar103[0x2e];
                                local_2c0[0x2f] = (RTCHitN)auVar103[0x2f];
                                local_2c0[0x30] = (RTCHitN)auVar103[0x30];
                                local_2c0[0x31] = (RTCHitN)auVar103[0x31];
                                local_2c0[0x32] = (RTCHitN)auVar103[0x32];
                                local_2c0[0x33] = (RTCHitN)auVar103[0x33];
                                local_2c0[0x34] = (RTCHitN)auVar103[0x34];
                                local_2c0[0x35] = (RTCHitN)auVar103[0x35];
                                local_2c0[0x36] = (RTCHitN)auVar103[0x36];
                                local_2c0[0x37] = (RTCHitN)auVar103[0x37];
                                local_2c0[0x38] = (RTCHitN)auVar103[0x38];
                                local_2c0[0x39] = (RTCHitN)auVar103[0x39];
                                local_2c0[0x3a] = (RTCHitN)auVar103[0x3a];
                                local_2c0[0x3b] = (RTCHitN)auVar103[0x3b];
                                local_2c0[0x3c] = (RTCHitN)auVar103[0x3c];
                                local_2c0[0x3d] = (RTCHitN)auVar103[0x3d];
                                local_2c0[0x3e] = (RTCHitN)auVar103[0x3e];
                                local_2c0[0x3f] = (RTCHitN)auVar103[0x3f];
                                local_180 = local_340._0_8_;
                                uStack_178 = local_340._8_8_;
                                uStack_170 = local_340._16_8_;
                                uStack_168 = local_340._24_8_;
                                uStack_160 = local_340._32_8_;
                                uStack_158 = local_340._40_8_;
                                uStack_150 = local_340._48_8_;
                                uStack_148 = local_340._56_8_;
                                auVar103 = vmovdqa64_avx512f(local_300);
                                local_140 = vmovdqa64_avx512f(auVar103);
                                vpcmpeqd_avx2(auVar103._0_32_,auVar103._0_32_);
                                local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                                local_c0 = vbroadcastss_avx512f
                                                     (ZEXT416(context->user->instPrimID[0]));
                                *(float *)(ray + k * 4 + 0x200) = fVar233;
                                local_440 = local_380;
                                local_660.valid = (int *)local_440;
                                local_660.geometryUserPtr = pGVar6->userPtr;
                                local_660.context = context->user;
                                local_660.hit = local_2c0;
                                local_660.N = 0x10;
                                local_660.ray = (RTCRayN *)ray;
                                if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                  (*pGVar6->intersectionFilterN)(&local_660);
                                  auVar58 = vxorps_avx512vl(auVar65,auVar65);
                                  auVar275 = ZEXT1664(auVar58);
                                  auVar270 = ZEXT464(0x3f800000);
                                  auVar105._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  in_ZMM18 = ZEXT3264(auVar105._32_32_);
                                  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar122 = ZEXT1664(auVar58);
                                  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar273 = ZEXT1664(auVar58);
                                  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar271 = ZEXT1664(auVar58);
                                }
                                auVar58 = auVar275._0_16_;
                                auVar103 = vmovdqa64_avx512f(local_440);
                                uVar27 = vptestmd_avx512f(auVar103,auVar103);
                                if ((short)uVar27 == 0) {
LAB_01b7cb87:
                                  *(float *)(ray + k * 4 + 0x200) = fVar252;
                                }
                                else {
                                  p_Var7 = context->args->filter;
                                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var7)(&local_660);
                                    auVar58 = vxorps_avx512vl(auVar58,auVar58);
                                    auVar275 = ZEXT1664(auVar58);
                                    auVar270 = ZEXT464(0x3f800000);
                                    auVar105._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    in_ZMM18 = ZEXT3264(auVar105._32_32_);
                                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                    auVar122 = ZEXT1664(auVar58);
                                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar273 = ZEXT1664(auVar58);
                                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar271 = ZEXT1664(auVar58);
                                  }
                                  auVar103 = vmovdqa64_avx512f(local_440);
                                  uVar53 = vptestmd_avx512f(auVar103,auVar103);
                                  if ((short)uVar53 == 0) goto LAB_01b7cb87;
                                  iVar118 = *(int *)(local_660.hit + 4);
                                  iVar274 = *(int *)(local_660.hit + 8);
                                  iVar34 = *(int *)(local_660.hit + 0xc);
                                  iVar35 = *(int *)(local_660.hit + 0x10);
                                  iVar36 = *(int *)(local_660.hit + 0x14);
                                  iVar37 = *(int *)(local_660.hit + 0x18);
                                  iVar38 = *(int *)(local_660.hit + 0x1c);
                                  iVar39 = *(int *)(local_660.hit + 0x20);
                                  iVar40 = *(int *)(local_660.hit + 0x24);
                                  iVar41 = *(int *)(local_660.hit + 0x28);
                                  iVar42 = *(int *)(local_660.hit + 0x2c);
                                  iVar43 = *(int *)(local_660.hit + 0x30);
                                  iVar44 = *(int *)(local_660.hit + 0x34);
                                  iVar45 = *(int *)(local_660.hit + 0x38);
                                  iVar46 = *(int *)(local_660.hit + 0x3c);
                                  bVar47 = (byte)uVar53;
                                  bVar25 = (bool)((byte)(uVar53 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar53 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar53 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar53 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar53 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar53 >> 6) & 1);
                                  bVar16 = (bool)((byte)(uVar53 >> 7) & 1);
                                  bVar17 = (byte)(uVar53 >> 8);
                                  bVar18 = (bool)((byte)(uVar53 >> 9) & 1);
                                  bVar19 = (bool)((byte)(uVar53 >> 10) & 1);
                                  bVar20 = (bool)((byte)(uVar53 >> 0xb) & 1);
                                  bVar21 = (bool)((byte)(uVar53 >> 0xc) & 1);
                                  bVar22 = (bool)((byte)(uVar53 >> 0xd) & 1);
                                  bVar23 = (bool)((byte)(uVar53 >> 0xe) & 1);
                                  bVar24 = SUB81(uVar53 >> 0xf,0);
                                  *(uint *)(local_660.ray + 0x300) =
                                       (uint)(bVar47 & 1) * *(int *)local_660.hit |
                                       (uint)!(bool)(bVar47 & 1) * *(int *)(local_660.ray + 0x300);
                                  *(uint *)(local_660.ray + 0x304) =
                                       (uint)bVar25 * iVar118 |
                                       (uint)!bVar25 * *(int *)(local_660.ray + 0x304);
                                  *(uint *)(local_660.ray + 0x308) =
                                       (uint)bVar11 * iVar274 |
                                       (uint)!bVar11 * *(int *)(local_660.ray + 0x308);
                                  *(uint *)(local_660.ray + 0x30c) =
                                       (uint)bVar12 * iVar34 |
                                       (uint)!bVar12 * *(int *)(local_660.ray + 0x30c);
                                  *(uint *)(local_660.ray + 0x310) =
                                       (uint)bVar13 * iVar35 |
                                       (uint)!bVar13 * *(int *)(local_660.ray + 0x310);
                                  *(uint *)(local_660.ray + 0x314) =
                                       (uint)bVar14 * iVar36 |
                                       (uint)!bVar14 * *(int *)(local_660.ray + 0x314);
                                  *(uint *)(local_660.ray + 0x318) =
                                       (uint)bVar15 * iVar37 |
                                       (uint)!bVar15 * *(int *)(local_660.ray + 0x318);
                                  *(uint *)(local_660.ray + 0x31c) =
                                       (uint)bVar16 * iVar38 |
                                       (uint)!bVar16 * *(int *)(local_660.ray + 0x31c);
                                  *(uint *)(local_660.ray + 800) =
                                       (uint)(bVar17 & 1) * iVar39 |
                                       (uint)!(bool)(bVar17 & 1) * *(int *)(local_660.ray + 800);
                                  *(uint *)(local_660.ray + 0x324) =
                                       (uint)bVar18 * iVar40 |
                                       (uint)!bVar18 * *(int *)(local_660.ray + 0x324);
                                  *(uint *)(local_660.ray + 0x328) =
                                       (uint)bVar19 * iVar41 |
                                       (uint)!bVar19 * *(int *)(local_660.ray + 0x328);
                                  *(uint *)(local_660.ray + 0x32c) =
                                       (uint)bVar20 * iVar42 |
                                       (uint)!bVar20 * *(int *)(local_660.ray + 0x32c);
                                  *(uint *)(local_660.ray + 0x330) =
                                       (uint)bVar21 * iVar43 |
                                       (uint)!bVar21 * *(int *)(local_660.ray + 0x330);
                                  *(uint *)(local_660.ray + 0x334) =
                                       (uint)bVar22 * iVar44 |
                                       (uint)!bVar22 * *(int *)(local_660.ray + 0x334);
                                  *(uint *)(local_660.ray + 0x338) =
                                       (uint)bVar23 * iVar45 |
                                       (uint)!bVar23 * *(int *)(local_660.ray + 0x338);
                                  *(uint *)(local_660.ray + 0x33c) =
                                       (uint)bVar24 * iVar46 |
                                       (uint)!bVar24 * *(int *)(local_660.ray + 0x33c);
                                  iVar118 = *(int *)(local_660.hit + 0x44);
                                  iVar274 = *(int *)(local_660.hit + 0x48);
                                  iVar34 = *(int *)(local_660.hit + 0x4c);
                                  iVar35 = *(int *)(local_660.hit + 0x50);
                                  iVar36 = *(int *)(local_660.hit + 0x54);
                                  iVar37 = *(int *)(local_660.hit + 0x58);
                                  iVar38 = *(int *)(local_660.hit + 0x5c);
                                  iVar39 = *(int *)(local_660.hit + 0x60);
                                  iVar40 = *(int *)(local_660.hit + 100);
                                  iVar41 = *(int *)(local_660.hit + 0x68);
                                  iVar42 = *(int *)(local_660.hit + 0x6c);
                                  iVar43 = *(int *)(local_660.hit + 0x70);
                                  iVar44 = *(int *)(local_660.hit + 0x74);
                                  iVar45 = *(int *)(local_660.hit + 0x78);
                                  iVar46 = *(int *)(local_660.hit + 0x7c);
                                  bVar25 = (bool)((byte)(uVar53 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar53 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar53 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar53 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar53 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar53 >> 6) & 1);
                                  bVar16 = (bool)((byte)(uVar53 >> 7) & 1);
                                  bVar18 = (bool)((byte)(uVar53 >> 9) & 1);
                                  bVar19 = (bool)((byte)(uVar53 >> 10) & 1);
                                  bVar20 = (bool)((byte)(uVar53 >> 0xb) & 1);
                                  bVar21 = (bool)((byte)(uVar53 >> 0xc) & 1);
                                  bVar22 = (bool)((byte)(uVar53 >> 0xd) & 1);
                                  bVar23 = (bool)((byte)(uVar53 >> 0xe) & 1);
                                  bVar24 = SUB81(uVar53 >> 0xf,0);
                                  *(uint *)(local_660.ray + 0x340) =
                                       (uint)(bVar47 & 1) * *(int *)(local_660.hit + 0x40) |
                                       (uint)!(bool)(bVar47 & 1) * *(int *)(local_660.ray + 0x340);
                                  *(uint *)(local_660.ray + 0x344) =
                                       (uint)bVar25 * iVar118 |
                                       (uint)!bVar25 * *(int *)(local_660.ray + 0x344);
                                  *(uint *)(local_660.ray + 0x348) =
                                       (uint)bVar11 * iVar274 |
                                       (uint)!bVar11 * *(int *)(local_660.ray + 0x348);
                                  *(uint *)(local_660.ray + 0x34c) =
                                       (uint)bVar12 * iVar34 |
                                       (uint)!bVar12 * *(int *)(local_660.ray + 0x34c);
                                  *(uint *)(local_660.ray + 0x350) =
                                       (uint)bVar13 * iVar35 |
                                       (uint)!bVar13 * *(int *)(local_660.ray + 0x350);
                                  *(uint *)(local_660.ray + 0x354) =
                                       (uint)bVar14 * iVar36 |
                                       (uint)!bVar14 * *(int *)(local_660.ray + 0x354);
                                  *(uint *)(local_660.ray + 0x358) =
                                       (uint)bVar15 * iVar37 |
                                       (uint)!bVar15 * *(int *)(local_660.ray + 0x358);
                                  *(uint *)(local_660.ray + 0x35c) =
                                       (uint)bVar16 * iVar38 |
                                       (uint)!bVar16 * *(int *)(local_660.ray + 0x35c);
                                  *(uint *)(local_660.ray + 0x360) =
                                       (uint)(bVar17 & 1) * iVar39 |
                                       (uint)!(bool)(bVar17 & 1) * *(int *)(local_660.ray + 0x360);
                                  *(uint *)(local_660.ray + 0x364) =
                                       (uint)bVar18 * iVar40 |
                                       (uint)!bVar18 * *(int *)(local_660.ray + 0x364);
                                  *(uint *)(local_660.ray + 0x368) =
                                       (uint)bVar19 * iVar41 |
                                       (uint)!bVar19 * *(int *)(local_660.ray + 0x368);
                                  *(uint *)(local_660.ray + 0x36c) =
                                       (uint)bVar20 * iVar42 |
                                       (uint)!bVar20 * *(int *)(local_660.ray + 0x36c);
                                  *(uint *)(local_660.ray + 0x370) =
                                       (uint)bVar21 * iVar43 |
                                       (uint)!bVar21 * *(int *)(local_660.ray + 0x370);
                                  *(uint *)(local_660.ray + 0x374) =
                                       (uint)bVar22 * iVar44 |
                                       (uint)!bVar22 * *(int *)(local_660.ray + 0x374);
                                  *(uint *)(local_660.ray + 0x378) =
                                       (uint)bVar23 * iVar45 |
                                       (uint)!bVar23 * *(int *)(local_660.ray + 0x378);
                                  *(uint *)(local_660.ray + 0x37c) =
                                       (uint)bVar24 * iVar46 |
                                       (uint)!bVar24 * *(int *)(local_660.ray + 0x37c);
                                  iVar118 = *(int *)(local_660.hit + 0x84);
                                  iVar274 = *(int *)(local_660.hit + 0x88);
                                  iVar34 = *(int *)(local_660.hit + 0x8c);
                                  iVar35 = *(int *)(local_660.hit + 0x90);
                                  iVar36 = *(int *)(local_660.hit + 0x94);
                                  iVar37 = *(int *)(local_660.hit + 0x98);
                                  iVar38 = *(int *)(local_660.hit + 0x9c);
                                  iVar39 = *(int *)(local_660.hit + 0xa0);
                                  iVar40 = *(int *)(local_660.hit + 0xa4);
                                  iVar41 = *(int *)(local_660.hit + 0xa8);
                                  iVar42 = *(int *)(local_660.hit + 0xac);
                                  iVar43 = *(int *)(local_660.hit + 0xb0);
                                  iVar44 = *(int *)(local_660.hit + 0xb4);
                                  iVar45 = *(int *)(local_660.hit + 0xb8);
                                  iVar46 = *(int *)(local_660.hit + 0xbc);
                                  bVar25 = (bool)((byte)(uVar53 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar53 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar53 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar53 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar53 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar53 >> 6) & 1);
                                  bVar16 = (bool)((byte)(uVar53 >> 7) & 1);
                                  bVar18 = (bool)((byte)(uVar53 >> 9) & 1);
                                  bVar19 = (bool)((byte)(uVar53 >> 10) & 1);
                                  bVar20 = (bool)((byte)(uVar53 >> 0xb) & 1);
                                  bVar21 = (bool)((byte)(uVar53 >> 0xc) & 1);
                                  bVar22 = (bool)((byte)(uVar53 >> 0xd) & 1);
                                  bVar23 = (bool)((byte)(uVar53 >> 0xe) & 1);
                                  bVar24 = SUB81(uVar53 >> 0xf,0);
                                  *(uint *)(local_660.ray + 0x380) =
                                       (uint)(bVar47 & 1) * *(int *)(local_660.hit + 0x80) |
                                       (uint)!(bool)(bVar47 & 1) * *(int *)(local_660.ray + 0x380);
                                  *(uint *)(local_660.ray + 900) =
                                       (uint)bVar25 * iVar118 |
                                       (uint)!bVar25 * *(int *)(local_660.ray + 900);
                                  *(uint *)(local_660.ray + 0x388) =
                                       (uint)bVar11 * iVar274 |
                                       (uint)!bVar11 * *(int *)(local_660.ray + 0x388);
                                  *(uint *)(local_660.ray + 0x38c) =
                                       (uint)bVar12 * iVar34 |
                                       (uint)!bVar12 * *(int *)(local_660.ray + 0x38c);
                                  *(uint *)(local_660.ray + 0x390) =
                                       (uint)bVar13 * iVar35 |
                                       (uint)!bVar13 * *(int *)(local_660.ray + 0x390);
                                  *(uint *)(local_660.ray + 0x394) =
                                       (uint)bVar14 * iVar36 |
                                       (uint)!bVar14 * *(int *)(local_660.ray + 0x394);
                                  *(uint *)(local_660.ray + 0x398) =
                                       (uint)bVar15 * iVar37 |
                                       (uint)!bVar15 * *(int *)(local_660.ray + 0x398);
                                  *(uint *)(local_660.ray + 0x39c) =
                                       (uint)bVar16 * iVar38 |
                                       (uint)!bVar16 * *(int *)(local_660.ray + 0x39c);
                                  *(uint *)(local_660.ray + 0x3a0) =
                                       (uint)(bVar17 & 1) * iVar39 |
                                       (uint)!(bool)(bVar17 & 1) * *(int *)(local_660.ray + 0x3a0);
                                  *(uint *)(local_660.ray + 0x3a4) =
                                       (uint)bVar18 * iVar40 |
                                       (uint)!bVar18 * *(int *)(local_660.ray + 0x3a4);
                                  *(uint *)(local_660.ray + 0x3a8) =
                                       (uint)bVar19 * iVar41 |
                                       (uint)!bVar19 * *(int *)(local_660.ray + 0x3a8);
                                  *(uint *)(local_660.ray + 0x3ac) =
                                       (uint)bVar20 * iVar42 |
                                       (uint)!bVar20 * *(int *)(local_660.ray + 0x3ac);
                                  *(uint *)(local_660.ray + 0x3b0) =
                                       (uint)bVar21 * iVar43 |
                                       (uint)!bVar21 * *(int *)(local_660.ray + 0x3b0);
                                  *(uint *)(local_660.ray + 0x3b4) =
                                       (uint)bVar22 * iVar44 |
                                       (uint)!bVar22 * *(int *)(local_660.ray + 0x3b4);
                                  *(uint *)(local_660.ray + 0x3b8) =
                                       (uint)bVar23 * iVar45 |
                                       (uint)!bVar23 * *(int *)(local_660.ray + 0x3b8);
                                  *(uint *)(local_660.ray + 0x3bc) =
                                       (uint)bVar24 * iVar46 |
                                       (uint)!bVar24 * *(int *)(local_660.ray + 0x3bc);
                                  iVar118 = *(int *)(local_660.hit + 0xc4);
                                  iVar274 = *(int *)(local_660.hit + 200);
                                  iVar34 = *(int *)(local_660.hit + 0xcc);
                                  iVar35 = *(int *)(local_660.hit + 0xd0);
                                  iVar36 = *(int *)(local_660.hit + 0xd4);
                                  iVar37 = *(int *)(local_660.hit + 0xd8);
                                  iVar38 = *(int *)(local_660.hit + 0xdc);
                                  iVar39 = *(int *)(local_660.hit + 0xe0);
                                  iVar40 = *(int *)(local_660.hit + 0xe4);
                                  iVar41 = *(int *)(local_660.hit + 0xe8);
                                  iVar42 = *(int *)(local_660.hit + 0xec);
                                  iVar43 = *(int *)(local_660.hit + 0xf0);
                                  iVar44 = *(int *)(local_660.hit + 0xf4);
                                  iVar45 = *(int *)(local_660.hit + 0xf8);
                                  iVar46 = *(int *)(local_660.hit + 0xfc);
                                  bVar25 = (bool)((byte)(uVar53 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar53 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar53 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar53 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar53 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar53 >> 6) & 1);
                                  bVar16 = (bool)((byte)(uVar53 >> 7) & 1);
                                  bVar18 = (bool)((byte)(uVar53 >> 9) & 1);
                                  bVar19 = (bool)((byte)(uVar53 >> 10) & 1);
                                  bVar20 = (bool)((byte)(uVar53 >> 0xb) & 1);
                                  bVar21 = (bool)((byte)(uVar53 >> 0xc) & 1);
                                  bVar22 = (bool)((byte)(uVar53 >> 0xd) & 1);
                                  bVar23 = (bool)((byte)(uVar53 >> 0xe) & 1);
                                  bVar24 = SUB81(uVar53 >> 0xf,0);
                                  *(uint *)(local_660.ray + 0x3c0) =
                                       (uint)(bVar47 & 1) * *(int *)(local_660.hit + 0xc0) |
                                       (uint)!(bool)(bVar47 & 1) * *(int *)(local_660.ray + 0x3c0);
                                  *(uint *)(local_660.ray + 0x3c4) =
                                       (uint)bVar25 * iVar118 |
                                       (uint)!bVar25 * *(int *)(local_660.ray + 0x3c4);
                                  *(uint *)(local_660.ray + 0x3c8) =
                                       (uint)bVar11 * iVar274 |
                                       (uint)!bVar11 * *(int *)(local_660.ray + 0x3c8);
                                  *(uint *)(local_660.ray + 0x3cc) =
                                       (uint)bVar12 * iVar34 |
                                       (uint)!bVar12 * *(int *)(local_660.ray + 0x3cc);
                                  *(uint *)(local_660.ray + 0x3d0) =
                                       (uint)bVar13 * iVar35 |
                                       (uint)!bVar13 * *(int *)(local_660.ray + 0x3d0);
                                  *(uint *)(local_660.ray + 0x3d4) =
                                       (uint)bVar14 * iVar36 |
                                       (uint)!bVar14 * *(int *)(local_660.ray + 0x3d4);
                                  *(uint *)(local_660.ray + 0x3d8) =
                                       (uint)bVar15 * iVar37 |
                                       (uint)!bVar15 * *(int *)(local_660.ray + 0x3d8);
                                  *(uint *)(local_660.ray + 0x3dc) =
                                       (uint)bVar16 * iVar38 |
                                       (uint)!bVar16 * *(int *)(local_660.ray + 0x3dc);
                                  *(uint *)(local_660.ray + 0x3e0) =
                                       (uint)(bVar17 & 1) * iVar39 |
                                       (uint)!(bool)(bVar17 & 1) * *(int *)(local_660.ray + 0x3e0);
                                  *(uint *)(local_660.ray + 0x3e4) =
                                       (uint)bVar18 * iVar40 |
                                       (uint)!bVar18 * *(int *)(local_660.ray + 0x3e4);
                                  *(uint *)(local_660.ray + 1000) =
                                       (uint)bVar19 * iVar41 |
                                       (uint)!bVar19 * *(int *)(local_660.ray + 1000);
                                  *(uint *)(local_660.ray + 0x3ec) =
                                       (uint)bVar20 * iVar42 |
                                       (uint)!bVar20 * *(int *)(local_660.ray + 0x3ec);
                                  *(uint *)(local_660.ray + 0x3f0) =
                                       (uint)bVar21 * iVar43 |
                                       (uint)!bVar21 * *(int *)(local_660.ray + 0x3f0);
                                  *(uint *)(local_660.ray + 0x3f4) =
                                       (uint)bVar22 * iVar44 |
                                       (uint)!bVar22 * *(int *)(local_660.ray + 0x3f4);
                                  *(uint *)(local_660.ray + 0x3f8) =
                                       (uint)bVar23 * iVar45 |
                                       (uint)!bVar23 * *(int *)(local_660.ray + 0x3f8);
                                  *(uint *)(local_660.ray + 0x3fc) =
                                       (uint)bVar24 * iVar46 |
                                       (uint)!bVar24 * *(int *)(local_660.ray + 0x3fc);
                                  iVar118 = *(int *)(local_660.hit + 0x104);
                                  iVar274 = *(int *)(local_660.hit + 0x108);
                                  iVar34 = *(int *)(local_660.hit + 0x10c);
                                  iVar35 = *(int *)(local_660.hit + 0x110);
                                  iVar36 = *(int *)(local_660.hit + 0x114);
                                  iVar37 = *(int *)(local_660.hit + 0x118);
                                  iVar38 = *(int *)(local_660.hit + 0x11c);
                                  iVar39 = *(int *)(local_660.hit + 0x120);
                                  iVar40 = *(int *)(local_660.hit + 0x124);
                                  iVar41 = *(int *)(local_660.hit + 0x128);
                                  iVar42 = *(int *)(local_660.hit + 300);
                                  iVar43 = *(int *)(local_660.hit + 0x130);
                                  iVar44 = *(int *)(local_660.hit + 0x134);
                                  iVar45 = *(int *)(local_660.hit + 0x138);
                                  iVar46 = *(int *)(local_660.hit + 0x13c);
                                  bVar25 = (bool)((byte)(uVar53 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar53 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar53 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar53 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar53 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar53 >> 6) & 1);
                                  bVar16 = (bool)((byte)(uVar53 >> 7) & 1);
                                  bVar18 = (bool)((byte)(uVar53 >> 9) & 1);
                                  bVar19 = (bool)((byte)(uVar53 >> 10) & 1);
                                  bVar20 = (bool)((byte)(uVar53 >> 0xb) & 1);
                                  bVar21 = (bool)((byte)(uVar53 >> 0xc) & 1);
                                  bVar22 = (bool)((byte)(uVar53 >> 0xd) & 1);
                                  bVar23 = (bool)((byte)(uVar53 >> 0xe) & 1);
                                  bVar24 = SUB81(uVar53 >> 0xf,0);
                                  *(uint *)(local_660.ray + 0x400) =
                                       (uint)(bVar47 & 1) * *(int *)(local_660.hit + 0x100) |
                                       (uint)!(bool)(bVar47 & 1) * *(int *)(local_660.ray + 0x400);
                                  *(uint *)(local_660.ray + 0x404) =
                                       (uint)bVar25 * iVar118 |
                                       (uint)!bVar25 * *(int *)(local_660.ray + 0x404);
                                  *(uint *)(local_660.ray + 0x408) =
                                       (uint)bVar11 * iVar274 |
                                       (uint)!bVar11 * *(int *)(local_660.ray + 0x408);
                                  *(uint *)(local_660.ray + 0x40c) =
                                       (uint)bVar12 * iVar34 |
                                       (uint)!bVar12 * *(int *)(local_660.ray + 0x40c);
                                  *(uint *)(local_660.ray + 0x410) =
                                       (uint)bVar13 * iVar35 |
                                       (uint)!bVar13 * *(int *)(local_660.ray + 0x410);
                                  *(uint *)(local_660.ray + 0x414) =
                                       (uint)bVar14 * iVar36 |
                                       (uint)!bVar14 * *(int *)(local_660.ray + 0x414);
                                  *(uint *)(local_660.ray + 0x418) =
                                       (uint)bVar15 * iVar37 |
                                       (uint)!bVar15 * *(int *)(local_660.ray + 0x418);
                                  *(uint *)(local_660.ray + 0x41c) =
                                       (uint)bVar16 * iVar38 |
                                       (uint)!bVar16 * *(int *)(local_660.ray + 0x41c);
                                  *(uint *)(local_660.ray + 0x420) =
                                       (uint)(bVar17 & 1) * iVar39 |
                                       (uint)!(bool)(bVar17 & 1) * *(int *)(local_660.ray + 0x420);
                                  *(uint *)(local_660.ray + 0x424) =
                                       (uint)bVar18 * iVar40 |
                                       (uint)!bVar18 * *(int *)(local_660.ray + 0x424);
                                  *(uint *)(local_660.ray + 0x428) =
                                       (uint)bVar19 * iVar41 |
                                       (uint)!bVar19 * *(int *)(local_660.ray + 0x428);
                                  *(uint *)(local_660.ray + 0x42c) =
                                       (uint)bVar20 * iVar42 |
                                       (uint)!bVar20 * *(int *)(local_660.ray + 0x42c);
                                  *(uint *)(local_660.ray + 0x430) =
                                       (uint)bVar21 * iVar43 |
                                       (uint)!bVar21 * *(int *)(local_660.ray + 0x430);
                                  *(uint *)(local_660.ray + 0x434) =
                                       (uint)bVar22 * iVar44 |
                                       (uint)!bVar22 * *(int *)(local_660.ray + 0x434);
                                  *(uint *)(local_660.ray + 0x438) =
                                       (uint)bVar23 * iVar45 |
                                       (uint)!bVar23 * *(int *)(local_660.ray + 0x438);
                                  *(uint *)(local_660.ray + 0x43c) =
                                       (uint)bVar24 * iVar46 |
                                       (uint)!bVar24 * *(int *)(local_660.ray + 0x43c);
                                  auVar103 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_660.hit + 0x140));
                                  auVar103 = vmovdqu32_avx512f(auVar103);
                                  *(undefined1 (*) [64])(local_660.ray + 0x440) = auVar103;
                                  auVar103 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_660.hit + 0x180));
                                  auVar103 = vmovdqu32_avx512f(auVar103);
                                  *(undefined1 (*) [64])(local_660.ray + 0x480) = auVar103;
                                  auVar272 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_660.hit + 0x1c0));
                                  auVar103 = vmovdqa32_avx512f(auVar272);
                                  *(undefined1 (*) [64])(local_660.ray + 0x4c0) = auVar103;
                                  auVar269 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_660.hit + 0x200));
                                  bVar25 = (bool)((byte)(uVar53 >> 1) & 1);
                                  auVar33._4_56_ = auVar269._8_56_;
                                  auVar33._0_4_ =
                                       (uint)bVar25 * auVar269._4_4_ |
                                       (uint)!bVar25 * auVar272._4_4_;
                                  auVar117._0_8_ = auVar33._0_8_ << 0x20;
                                  bVar25 = (bool)((byte)(uVar53 >> 2) & 1);
                                  auVar117._8_4_ =
                                       (uint)bVar25 * auVar269._8_4_ |
                                       (uint)!bVar25 * auVar272._8_4_;
                                  bVar25 = (bool)((byte)(uVar53 >> 3) & 1);
                                  auVar117._12_4_ =
                                       (uint)bVar25 * auVar269._12_4_ |
                                       (uint)!bVar25 * auVar272._12_4_;
                                  bVar25 = (bool)((byte)(uVar53 >> 4) & 1);
                                  auVar117._16_4_ =
                                       (uint)bVar25 * auVar269._16_4_ |
                                       (uint)!bVar25 * auVar272._16_4_;
                                  bVar25 = (bool)((byte)(uVar53 >> 5) & 1);
                                  auVar117._20_4_ =
                                       (uint)bVar25 * auVar269._20_4_ |
                                       (uint)!bVar25 * auVar272._20_4_;
                                  bVar25 = (bool)((byte)(uVar53 >> 6) & 1);
                                  auVar117._24_4_ =
                                       (uint)bVar25 * auVar269._24_4_ |
                                       (uint)!bVar25 * auVar272._24_4_;
                                  bVar25 = (bool)((byte)(uVar53 >> 7) & 1);
                                  auVar117._28_4_ =
                                       (uint)bVar25 * auVar269._28_4_ |
                                       (uint)!bVar25 * auVar272._28_4_;
                                  auVar117._32_4_ =
                                       (uint)(bVar17 & 1) * auVar269._32_4_ |
                                       (uint)!(bool)(bVar17 & 1) * auVar272._32_4_;
                                  bVar25 = (bool)((byte)(uVar53 >> 9) & 1);
                                  auVar117._36_4_ =
                                       (uint)bVar25 * auVar269._36_4_ |
                                       (uint)!bVar25 * auVar272._36_4_;
                                  bVar25 = (bool)((byte)(uVar53 >> 10) & 1);
                                  auVar117._40_4_ =
                                       (uint)bVar25 * auVar269._40_4_ |
                                       (uint)!bVar25 * auVar272._40_4_;
                                  bVar25 = (bool)((byte)(uVar53 >> 0xb) & 1);
                                  auVar117._44_4_ =
                                       (uint)bVar25 * auVar269._44_4_ |
                                       (uint)!bVar25 * auVar272._44_4_;
                                  bVar25 = (bool)((byte)(uVar53 >> 0xc) & 1);
                                  auVar117._48_4_ =
                                       (uint)bVar25 * auVar269._48_4_ |
                                       (uint)!bVar25 * auVar272._48_4_;
                                  bVar25 = (bool)((byte)(uVar53 >> 0xd) & 1);
                                  auVar117._52_4_ =
                                       (uint)bVar25 * auVar269._52_4_ |
                                       (uint)!bVar25 * auVar272._52_4_;
                                  bVar25 = (bool)((byte)(uVar53 >> 0xe) & 1);
                                  auVar117._56_4_ =
                                       (uint)bVar25 * auVar269._56_4_ |
                                       (uint)!bVar25 * auVar272._56_4_;
                                  bVar25 = SUB81(uVar53 >> 0xf,0);
                                  auVar117._60_4_ =
                                       (uint)bVar25 * auVar269._60_4_ |
                                       (uint)!bVar25 * auVar272._60_4_;
                                  auVar103._16_48_ = auVar117._16_48_;
                                  auVar272 = vmovdqa32_avx512f(auVar269);
                                  *(undefined1 (*) [64])(local_660.ray + 0x500) = auVar272;
                                }
                                auVar269 = ZEXT1664(auVar60);
                                auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar272 = ZEXT1664(auVar58);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar52 = lVar52 + -1;
              } while (lVar52 != 0);
            }
          }
          else {
            auVar58 = vxorps_avx512vl(ZEXT416(5),auVar65);
            auVar275 = ZEXT1664(auVar58);
          }
        }
      }
      auVar105._32_32_ = auVar103._32_32_;
    } while (bVar10);
    auVar58 = vinsertps_avx512f(auVar66,auVar69,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }